

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersectorK<8,8>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [32];
  float *pfVar6;
  undefined4 uVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Primitive PVar17;
  Geometry *pGVar18;
  RTCFilterFunctionN p_Var19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  long lVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined8 uVar91;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [28];
  undefined1 auVar98 [28];
  uint uVar99;
  int iVar100;
  uint uVar101;
  ulong uVar102;
  ulong uVar103;
  ulong uVar104;
  Geometry *geometry;
  long lVar105;
  ulong uVar106;
  bool bVar107;
  bool bVar108;
  undefined4 uVar109;
  undefined8 uVar110;
  undefined1 auVar111 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar112 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined8 uVar126;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  undefined1 extraout_var [56];
  float fVar137;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar138;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar152 [64];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined8 uVar174;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar192;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 in_ZMM10 [64];
  undefined4 uVar206;
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  float fVar209;
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  float fVar214;
  undefined1 in_ZMM12 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar215 [32];
  float fVar218;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar219;
  float fVar223;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  bool local_94d;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  RTCFilterFunctionNArguments local_770;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined1 auStack_6f0 [8];
  float fStack_6e8;
  undefined1 local_6e0 [32];
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  int iStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  LinearSpace3fa *local_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 auStack_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  ulong local_540;
  uint uStack_538;
  uint uStack_534;
  uint uStack_530;
  uint uStack_52c;
  uint uStack_528;
  uint uStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined4 local_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  int local_400;
  int local_3fc;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined1 local_3a0 [32];
  float local_380 [4];
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar136 [64];
  
  PVar17 = prim[1];
  uVar106 = (ulong)(byte)PVar17;
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar21 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar21 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar138 = *(float *)(prim + uVar106 * 0x19 + 0x12);
  auVar20 = vsubps_avx(auVar20,*(undefined1 (*) [16])(prim + uVar106 * 0x19 + 6));
  auVar111._0_4_ = fVar138 * auVar20._0_4_;
  auVar111._4_4_ = fVar138 * auVar20._4_4_;
  auVar111._8_4_ = fVar138 * auVar20._8_4_;
  auVar111._12_4_ = fVar138 * auVar20._12_4_;
  auVar175._0_4_ = fVar138 * auVar21._0_4_;
  auVar175._4_4_ = fVar138 * auVar21._4_4_;
  auVar175._8_4_ = fVar138 * auVar21._8_4_;
  auVar175._12_4_ = fVar138 * auVar21._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar106 * 4 + 6);
  auVar114 = vpmovsxbd_avx2(auVar20);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar106 * 5 + 6);
  auVar124 = vpmovsxbd_avx2(auVar21);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar106 * 6 + 6);
  auVar167 = vpmovsxbd_avx2(auVar10);
  auVar167 = vcvtdq2ps_avx(auVar167);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar106 * 0xb + 6);
  auVar122 = vpmovsxbd_avx2(auVar11);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar17 * 0xc) + 6);
  auVar132 = vpmovsxbd_avx2(auVar12);
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (uint)(byte)PVar17 * 0xc + uVar106 + 6);
  auVar23 = vpmovsxbd_avx2(auVar13);
  auVar23 = vcvtdq2ps_avx(auVar23);
  uVar102 = (ulong)(uint)((int)(uVar106 * 9) * 2);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar102 + 6);
  auVar163 = vpmovsxbd_avx2(auVar14);
  auVar163 = vcvtdq2ps_avx(auVar163);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar102 + uVar106 + 6);
  auVar24 = vpmovsxbd_avx2(auVar15);
  auVar24 = vcvtdq2ps_avx(auVar24);
  uVar102 = (ulong)(uint)((int)(uVar106 * 5) << 2);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar102 + 6);
  auVar125 = vpmovsxbd_avx2(auVar16);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar215._4_4_ = auVar175._0_4_;
  auVar215._0_4_ = auVar175._0_4_;
  auVar215._8_4_ = auVar175._0_4_;
  auVar215._12_4_ = auVar175._0_4_;
  auVar215._16_4_ = auVar175._0_4_;
  auVar215._20_4_ = auVar175._0_4_;
  auVar215._24_4_ = auVar175._0_4_;
  auVar215._28_4_ = auVar175._0_4_;
  auVar20 = vmovshdup_avx(auVar175);
  uVar174 = auVar20._0_8_;
  auVar220._8_8_ = uVar174;
  auVar220._0_8_ = uVar174;
  auVar220._16_8_ = uVar174;
  auVar220._24_8_ = uVar174;
  auVar20 = vshufps_avx(auVar175,auVar175,0xaa);
  fVar138 = auVar20._0_4_;
  auVar135._0_4_ = fVar138 * auVar167._0_4_;
  fVar137 = auVar20._4_4_;
  auVar135._4_4_ = fVar137 * auVar167._4_4_;
  auVar135._8_4_ = fVar138 * auVar167._8_4_;
  auVar135._12_4_ = fVar137 * auVar167._12_4_;
  auVar135._16_4_ = fVar138 * auVar167._16_4_;
  auVar135._20_4_ = fVar137 * auVar167._20_4_;
  auVar135._28_36_ = in_ZMM12._28_36_;
  auVar135._24_4_ = fVar138 * auVar167._24_4_;
  auVar212._0_4_ = auVar23._0_4_ * fVar138;
  auVar212._4_4_ = auVar23._4_4_ * fVar137;
  auVar212._8_4_ = auVar23._8_4_ * fVar138;
  auVar212._12_4_ = auVar23._12_4_ * fVar137;
  auVar212._16_4_ = auVar23._16_4_ * fVar138;
  auVar212._20_4_ = auVar23._20_4_ * fVar137;
  auVar212._28_36_ = in_ZMM10._28_36_;
  auVar212._24_4_ = auVar23._24_4_ * fVar138;
  auVar189._0_4_ = auVar125._0_4_ * fVar138;
  auVar189._4_4_ = auVar125._4_4_ * fVar137;
  auVar189._8_4_ = auVar125._8_4_ * fVar138;
  auVar189._12_4_ = auVar125._12_4_ * fVar137;
  auVar189._16_4_ = auVar125._16_4_ * fVar138;
  auVar189._20_4_ = auVar125._20_4_ * fVar137;
  auVar189._24_4_ = auVar125._24_4_ * fVar138;
  auVar189._28_4_ = 0;
  auVar20 = vfmadd231ps_fma(auVar135._0_32_,auVar220,auVar124);
  auVar21 = vfmadd231ps_fma(auVar212._0_32_,auVar220,auVar132);
  auVar10 = vfmadd231ps_fma(auVar189,auVar24,auVar220);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar215,auVar114);
  auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar215,auVar122);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar163,auVar215);
  auVar181._4_4_ = auVar111._0_4_;
  auVar181._0_4_ = auVar111._0_4_;
  auVar181._8_4_ = auVar111._0_4_;
  auVar181._12_4_ = auVar111._0_4_;
  auVar181._16_4_ = auVar111._0_4_;
  auVar181._20_4_ = auVar111._0_4_;
  auVar181._24_4_ = auVar111._0_4_;
  auVar181._28_4_ = auVar111._0_4_;
  auVar20 = vmovshdup_avx(auVar111);
  uVar174 = auVar20._0_8_;
  auVar221._8_8_ = uVar174;
  auVar221._0_8_ = uVar174;
  auVar221._16_8_ = uVar174;
  auVar221._24_8_ = uVar174;
  auVar20 = vshufps_avx(auVar111,auVar111,0xaa);
  fVar138 = auVar20._0_4_;
  auVar143._0_4_ = fVar138 * auVar167._0_4_;
  fVar137 = auVar20._4_4_;
  auVar143._4_4_ = fVar137 * auVar167._4_4_;
  auVar143._8_4_ = fVar138 * auVar167._8_4_;
  auVar143._12_4_ = fVar137 * auVar167._12_4_;
  auVar143._16_4_ = fVar138 * auVar167._16_4_;
  auVar143._20_4_ = fVar137 * auVar167._20_4_;
  auVar143._24_4_ = fVar138 * auVar167._24_4_;
  auVar143._28_4_ = 0;
  auVar22._4_4_ = auVar23._4_4_ * fVar137;
  auVar22._0_4_ = auVar23._0_4_ * fVar138;
  auVar22._8_4_ = auVar23._8_4_ * fVar138;
  auVar22._12_4_ = auVar23._12_4_ * fVar137;
  auVar22._16_4_ = auVar23._16_4_ * fVar138;
  auVar22._20_4_ = auVar23._20_4_ * fVar137;
  auVar22._24_4_ = auVar23._24_4_ * fVar138;
  auVar22._28_4_ = auVar167._28_4_;
  auVar167._4_4_ = auVar125._4_4_ * fVar137;
  auVar167._0_4_ = auVar125._0_4_ * fVar138;
  auVar167._8_4_ = auVar125._8_4_ * fVar138;
  auVar167._12_4_ = auVar125._12_4_ * fVar137;
  auVar167._16_4_ = auVar125._16_4_ * fVar138;
  auVar167._20_4_ = auVar125._20_4_ * fVar137;
  auVar167._24_4_ = auVar125._24_4_ * fVar138;
  auVar167._28_4_ = fVar137;
  auVar20 = vfmadd231ps_fma(auVar143,auVar221,auVar124);
  auVar12 = vfmadd231ps_fma(auVar22,auVar221,auVar132);
  auVar13 = vfmadd231ps_fma(auVar167,auVar221,auVar24);
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar181,auVar114);
  local_2c0._8_4_ = 0x7fffffff;
  local_2c0._0_8_ = 0x7fffffff7fffffff;
  local_2c0._12_4_ = 0x7fffffff;
  local_2c0._16_4_ = 0x7fffffff;
  local_2c0._20_4_ = 0x7fffffff;
  local_2c0._24_4_ = 0x7fffffff;
  local_2c0._28_4_ = 0x7fffffff;
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar181,auVar122);
  auVar114 = vandps_avx(ZEXT1632(auVar11),local_2c0);
  auVar179._8_4_ = 0x219392ef;
  auVar179._0_8_ = 0x219392ef219392ef;
  auVar179._12_4_ = 0x219392ef;
  auVar179._16_4_ = 0x219392ef;
  auVar179._20_4_ = 0x219392ef;
  auVar179._24_4_ = 0x219392ef;
  auVar179._28_4_ = 0x219392ef;
  auVar114 = vcmpps_avx(auVar114,auVar179,1);
  auVar124 = vblendvps_avx(ZEXT1632(auVar11),auVar179,auVar114);
  auVar114 = vandps_avx(ZEXT1632(auVar21),local_2c0);
  auVar114 = vcmpps_avx(auVar114,auVar179,1);
  auVar167 = vblendvps_avx(ZEXT1632(auVar21),auVar179,auVar114);
  auVar114 = vandps_avx(ZEXT1632(auVar10),local_2c0);
  auVar114 = vcmpps_avx(auVar114,auVar179,1);
  auVar122 = vrcpps_avx(auVar124);
  auVar114 = vblendvps_avx(ZEXT1632(auVar10),auVar179,auVar114);
  auVar184._8_4_ = 0x3f800000;
  auVar184._0_8_ = &DAT_3f8000003f800000;
  auVar184._12_4_ = 0x3f800000;
  auVar184._16_4_ = 0x3f800000;
  auVar184._20_4_ = 0x3f800000;
  auVar184._24_4_ = 0x3f800000;
  auVar184._28_4_ = 0x3f800000;
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar181,auVar163);
  auVar132 = vrcpps_avx(auVar167);
  auVar20 = vfnmadd213ps_fma(auVar124,auVar122,auVar184);
  auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar122,auVar122);
  auVar21 = vfnmadd213ps_fma(auVar167,auVar132,auVar184);
  auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar132,auVar132);
  auVar124 = vrcpps_avx(auVar114);
  auVar10 = vfnmadd213ps_fma(auVar114,auVar124,auVar184);
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar106 * 7 + 6));
  auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar124,auVar124);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar14));
  auVar122._4_4_ = auVar20._4_4_ * auVar114._4_4_;
  auVar122._0_4_ = auVar20._0_4_ * auVar114._0_4_;
  auVar122._8_4_ = auVar20._8_4_ * auVar114._8_4_;
  auVar122._12_4_ = auVar20._12_4_ * auVar114._12_4_;
  auVar122._16_4_ = auVar114._16_4_ * 0.0;
  auVar122._20_4_ = auVar114._20_4_ * 0.0;
  auVar122._24_4_ = auVar114._24_4_ * 0.0;
  auVar122._28_4_ = auVar114._28_4_;
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar106 * 9 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar14));
  auVar127._0_4_ = auVar20._0_4_ * auVar114._0_4_;
  auVar127._4_4_ = auVar20._4_4_ * auVar114._4_4_;
  auVar127._8_4_ = auVar20._8_4_ * auVar114._8_4_;
  auVar127._12_4_ = auVar20._12_4_ * auVar114._12_4_;
  auVar127._16_4_ = auVar114._16_4_ * 0.0;
  auVar127._20_4_ = auVar114._20_4_ * 0.0;
  auVar127._24_4_ = auVar114._24_4_ * 0.0;
  auVar127._28_4_ = 0;
  auVar125._1_3_ = 0;
  auVar125[0] = PVar17;
  auVar124 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar17 * 0x10 + 6));
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar17 * 0x10 + uVar106 * -2 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar12));
  auVar132._4_4_ = auVar114._4_4_ * auVar21._4_4_;
  auVar132._0_4_ = auVar114._0_4_ * auVar21._0_4_;
  auVar132._8_4_ = auVar114._8_4_ * auVar21._8_4_;
  auVar132._12_4_ = auVar114._12_4_ * auVar21._12_4_;
  auVar132._16_4_ = auVar114._16_4_ * 0.0;
  auVar132._20_4_ = auVar114._20_4_ * 0.0;
  auVar132._24_4_ = auVar114._24_4_ * 0.0;
  auVar132._28_4_ = auVar114._28_4_;
  auVar114 = vcvtdq2ps_avx(auVar124);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar12));
  auVar23._4_4_ = auVar21._4_4_ * auVar114._4_4_;
  auVar23._0_4_ = auVar21._0_4_ * auVar114._0_4_;
  auVar23._8_4_ = auVar21._8_4_ * auVar114._8_4_;
  auVar23._12_4_ = auVar21._12_4_ * auVar114._12_4_;
  auVar23._16_4_ = auVar114._16_4_ * 0.0;
  auVar23._20_4_ = auVar114._20_4_ * 0.0;
  auVar23._24_4_ = auVar114._24_4_ * 0.0;
  auVar23._28_4_ = auVar114._28_4_;
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 + uVar106 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar11));
  auVar163._4_4_ = auVar114._4_4_ * auVar10._4_4_;
  auVar163._0_4_ = auVar114._0_4_ * auVar10._0_4_;
  auVar163._8_4_ = auVar114._8_4_ * auVar10._8_4_;
  auVar163._12_4_ = auVar114._12_4_ * auVar10._12_4_;
  auVar163._16_4_ = auVar114._16_4_ * 0.0;
  auVar163._20_4_ = auVar114._20_4_ * 0.0;
  auVar163._24_4_ = auVar114._24_4_ * 0.0;
  auVar163._28_4_ = auVar114._28_4_;
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar106 * 0x17 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar11));
  auVar24._4_4_ = auVar10._4_4_ * auVar114._4_4_;
  auVar24._0_4_ = auVar10._0_4_ * auVar114._0_4_;
  auVar24._8_4_ = auVar10._8_4_ * auVar114._8_4_;
  auVar24._12_4_ = auVar10._12_4_ * auVar114._12_4_;
  auVar24._16_4_ = auVar114._16_4_ * 0.0;
  auVar24._20_4_ = auVar114._20_4_ * 0.0;
  auVar24._24_4_ = auVar114._24_4_ * 0.0;
  auVar24._28_4_ = auVar114._28_4_;
  auVar114 = vpminsd_avx2(auVar122,auVar127);
  auVar124 = vpminsd_avx2(auVar132,auVar23);
  auVar114 = vmaxps_avx(auVar114,auVar124);
  auVar124 = vpminsd_avx2(auVar163,auVar24);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar193._4_4_ = uVar109;
  auVar193._0_4_ = uVar109;
  auVar193._8_4_ = uVar109;
  auVar193._12_4_ = uVar109;
  auVar193._16_4_ = uVar109;
  auVar193._20_4_ = uVar109;
  auVar193._24_4_ = uVar109;
  auVar193._28_4_ = uVar109;
  auVar124 = vmaxps_avx(auVar124,auVar193);
  auVar114 = vmaxps_avx(auVar114,auVar124);
  local_80._4_4_ = auVar114._4_4_ * 0.99999964;
  local_80._0_4_ = auVar114._0_4_ * 0.99999964;
  local_80._8_4_ = auVar114._8_4_ * 0.99999964;
  local_80._12_4_ = auVar114._12_4_ * 0.99999964;
  local_80._16_4_ = auVar114._16_4_ * 0.99999964;
  local_80._20_4_ = auVar114._20_4_ * 0.99999964;
  local_80._24_4_ = auVar114._24_4_ * 0.99999964;
  local_80._28_4_ = 0x3f7ffffa;
  auVar114 = vpmaxsd_avx2(auVar122,auVar127);
  auVar124 = vpmaxsd_avx2(auVar132,auVar23);
  auVar114 = vminps_avx(auVar114,auVar124);
  auVar124 = vpmaxsd_avx2(auVar163,auVar24);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar116._4_4_ = uVar109;
  auVar116._0_4_ = uVar109;
  auVar116._8_4_ = uVar109;
  auVar116._12_4_ = uVar109;
  auVar116._16_4_ = uVar109;
  auVar116._20_4_ = uVar109;
  auVar116._24_4_ = uVar109;
  auVar116._28_4_ = uVar109;
  auVar124 = vminps_avx(auVar124,auVar116);
  auVar114 = vminps_avx(auVar114,auVar124);
  auVar124._4_4_ = auVar114._4_4_ * 1.0000004;
  auVar124._0_4_ = auVar114._0_4_ * 1.0000004;
  auVar124._8_4_ = auVar114._8_4_ * 1.0000004;
  auVar124._12_4_ = auVar114._12_4_ * 1.0000004;
  auVar124._16_4_ = auVar114._16_4_ * 1.0000004;
  auVar124._20_4_ = auVar114._20_4_ * 1.0000004;
  auVar124._24_4_ = auVar114._24_4_ * 1.0000004;
  auVar124._28_4_ = auVar114._28_4_;
  auVar125[4] = PVar17;
  auVar125._5_3_ = 0;
  auVar125[8] = PVar17;
  auVar125._9_3_ = 0;
  auVar125[0xc] = PVar17;
  auVar125._13_3_ = 0;
  auVar125[0x10] = PVar17;
  auVar125._17_3_ = 0;
  auVar125[0x14] = PVar17;
  auVar125._21_3_ = 0;
  auVar125[0x18] = PVar17;
  auVar125._25_3_ = 0;
  auVar125[0x1c] = PVar17;
  auVar125._29_3_ = 0;
  auVar114 = vcmpps_avx(local_80,auVar124,2);
  auVar124 = vpcmpgtd_avx2(auVar125,_DAT_0205a920);
  auVar114 = vandps_avx(auVar114,auVar124);
  uVar99 = vmovmskps_avx(auVar114);
  local_94d = uVar99 != 0;
  if (local_94d) {
    uVar99 = uVar99 & 0xff;
    local_5a8 = pre->ray_space + k;
    local_5a0 = mm_lookupmask_ps._16_8_;
    uStack_598 = mm_lookupmask_ps._24_8_;
    uStack_590 = mm_lookupmask_ps._16_8_;
    uStack_588 = mm_lookupmask_ps._24_8_;
    iVar100 = 1 << ((uint)k & 0x1f);
    auVar114._4_4_ = iVar100;
    auVar114._0_4_ = iVar100;
    auVar114._8_4_ = iVar100;
    auVar114._12_4_ = iVar100;
    auVar114._16_4_ = iVar100;
    auVar114._20_4_ = iVar100;
    auVar114._24_4_ = iVar100;
    auVar114._28_4_ = iVar100;
    auVar124 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar114 = vpand_avx2(auVar114,auVar124);
    local_2e0 = vpcmpeqd_avx2(auVar114,auVar124);
    local_470 = 0x7fffffff;
    uStack_46c = 0x7fffffff;
    uStack_468 = 0x7fffffff;
    uStack_464 = 0x7fffffff;
    do {
      auVar114 = local_520;
      lVar25 = 0;
      uVar106 = (ulong)uVar99;
      for (uVar102 = uVar106; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar99 = *(uint *)(prim + 2);
      local_6e0._4_4_ = *(undefined4 *)(prim + lVar25 * 4 + 6);
      local_540 = (ulong)(uint)local_6e0._4_4_;
      pGVar18 = (context->scene->geometries).items[uVar99].ptr;
      uVar102 = (ulong)*(uint *)(*(long *)&pGVar18->field_0x58 +
                                pGVar18[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * local_540);
      p_Var19 = pGVar18[1].intersectionFilterN;
      lVar25 = *(long *)&pGVar18[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar25 + (long)p_Var19 * uVar102);
      uVar174 = *(undefined8 *)*pauVar1;
      uVar91 = *(undefined8 *)(*pauVar1 + 8);
      auVar21 = *pauVar1;
      auVar20 = *pauVar1;
      pauVar2 = (undefined1 (*) [16])(lVar25 + (uVar102 + 1) * (long)p_Var19);
      local_690 = *(undefined8 *)*pauVar2;
      uStack_688 = *(undefined8 *)(*pauVar2 + 8);
      pauVar3 = (undefined1 (*) [16])(lVar25 + (uVar102 + 2) * (long)p_Var19);
      local_6a0 = *(undefined8 *)*pauVar3;
      uStack_698 = *(undefined8 *)(*pauVar3 + 8);
      uVar106 = uVar106 - 1 & uVar106;
      pauVar4 = (undefined1 (*) [16])(lVar25 + (uVar102 + 3) * (long)p_Var19);
      local_6b0 = *(undefined8 *)*pauVar4;
      uStack_6a8 = *(undefined8 *)(*pauVar4 + 8);
      if (uVar106 != 0) {
        uVar104 = uVar106 - 1 & uVar106;
        for (uVar102 = uVar106; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x8000000000000000) {
        }
        if (uVar104 != 0) {
          for (; (uVar104 & 1) == 0; uVar104 = uVar104 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar100 = (int)pGVar18[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar13 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar11 = vsubps_avx(*pauVar1,auVar13);
      uVar109 = auVar11._0_4_;
      auVar153._4_4_ = uVar109;
      auVar153._0_4_ = uVar109;
      auVar153._8_4_ = uVar109;
      auVar153._12_4_ = uVar109;
      auVar10 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      aVar8 = (local_5a8->vx).field_0;
      aVar9 = (local_5a8->vy).field_0;
      fVar138 = (local_5a8->vz).field_0.m128[0];
      fVar137 = *(float *)((long)&(local_5a8->vz).field_0 + 4);
      fVar168 = *(float *)((long)&(local_5a8->vz).field_0 + 8);
      fVar169 = *(float *)((long)&(local_5a8->vz).field_0 + 0xc);
      auVar176._0_4_ = fVar138 * auVar11._0_4_;
      auVar176._4_4_ = fVar137 * auVar11._4_4_;
      auVar176._8_4_ = fVar168 * auVar11._8_4_;
      auVar176._12_4_ = fVar169 * auVar11._12_4_;
      auVar10 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar9,auVar10);
      auVar15 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar8,auVar153);
      auVar10 = vblendps_avx(auVar15,*pauVar1,8);
      auVar12 = vsubps_avx(*pauVar2,auVar13);
      uVar109 = auVar12._0_4_;
      auVar177._4_4_ = uVar109;
      auVar177._0_4_ = uVar109;
      auVar177._8_4_ = uVar109;
      auVar177._12_4_ = uVar109;
      auVar11 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar204._0_4_ = fVar138 * auVar12._0_4_;
      auVar204._4_4_ = fVar137 * auVar12._4_4_;
      auVar204._8_4_ = fVar168 * auVar12._8_4_;
      auVar204._12_4_ = fVar169 * auVar12._12_4_;
      auVar11 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar9,auVar11);
      auVar16 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar8,auVar177);
      auVar11 = vblendps_avx(auVar16,*pauVar2,8);
      auVar14 = vsubps_avx(*pauVar3,auVar13);
      uVar109 = auVar14._0_4_;
      auVar187._4_4_ = uVar109;
      auVar187._0_4_ = uVar109;
      auVar187._8_4_ = uVar109;
      auVar187._12_4_ = uVar109;
      auVar12 = vshufps_avx(auVar14,auVar14,0x55);
      auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar207._0_4_ = fVar138 * auVar14._0_4_;
      auVar207._4_4_ = fVar137 * auVar14._4_4_;
      auVar207._8_4_ = fVar168 * auVar14._8_4_;
      auVar207._12_4_ = fVar169 * auVar14._12_4_;
      auVar12 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar9,auVar12);
      auVar111 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar8,auVar187);
      auVar12 = vblendps_avx(auVar111,*pauVar3,8);
      auVar14 = vsubps_avx(*pauVar4,auVar13);
      uVar109 = auVar14._0_4_;
      auVar188._4_4_ = uVar109;
      auVar188._0_4_ = uVar109;
      auVar188._8_4_ = uVar109;
      auVar188._12_4_ = uVar109;
      auVar13 = vshufps_avx(auVar14,auVar14,0x55);
      auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar210._0_4_ = fVar138 * auVar14._0_4_;
      auVar210._4_4_ = fVar137 * auVar14._4_4_;
      auVar210._8_4_ = fVar168 * auVar14._8_4_;
      auVar210._12_4_ = fVar169 * auVar14._12_4_;
      auVar13 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar9,auVar13);
      auVar175 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar8,auVar188);
      auVar13 = vblendps_avx(auVar175,*pauVar4,8);
      auVar27._4_4_ = uStack_46c;
      auVar27._0_4_ = local_470;
      auVar27._8_4_ = uStack_468;
      auVar27._12_4_ = uStack_464;
      auVar10 = vandps_avx(auVar10,auVar27);
      auVar11 = vandps_avx(auVar11,auVar27);
      auVar14 = vmaxps_avx(auVar10,auVar11);
      auVar10 = vandps_avx(auVar12,auVar27);
      auVar11 = vandps_avx(auVar13,auVar27);
      auVar10 = vmaxps_avx(auVar10,auVar11);
      auVar10 = vmaxps_avx(auVar14,auVar10);
      auVar11 = vmovshdup_avx(auVar10);
      auVar11 = vmaxss_avx(auVar11,auVar10);
      auVar10 = vshufpd_avx(auVar10,auVar10,1);
      auVar10 = vmaxss_avx(auVar10,auVar11);
      lVar25 = (long)iVar100 * 0x44;
      auVar11 = vmovshdup_avx(auVar15);
      uVar110 = auVar11._0_8_;
      local_560._8_8_ = uVar110;
      local_560._0_8_ = uVar110;
      local_560._16_8_ = uVar110;
      local_560._24_8_ = uVar110;
      auVar124 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x484);
      auVar11 = vmovshdup_avx(auVar16);
      uVar110 = auVar11._0_8_;
      local_500._8_8_ = uVar110;
      local_500._0_8_ = uVar110;
      local_500._16_8_ = uVar110;
      local_500._24_8_ = uVar110;
      auVar167 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x908);
      uVar206 = auVar111._0_4_;
      local_600._4_4_ = uVar206;
      local_600._0_4_ = uVar206;
      local_600._8_4_ = uVar206;
      local_600._12_4_ = uVar206;
      local_600._16_4_ = uVar206;
      local_600._20_4_ = uVar206;
      local_600._24_4_ = uVar206;
      local_600._28_4_ = uVar206;
      auVar11 = vmovshdup_avx(auVar111);
      uVar110 = auVar11._0_8_;
      auVar161._8_8_ = uVar110;
      auVar161._0_8_ = uVar110;
      auVar161._16_8_ = uVar110;
      auVar161._24_8_ = uVar110;
      fVar137 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar25 + 0xd8c);
      fVar168 = *(float *)(catmullrom_basis0 + lVar25 + 0xd90);
      fVar169 = *(float *)(catmullrom_basis0 + lVar25 + 0xd94);
      fVar170 = *(float *)(catmullrom_basis0 + lVar25 + 0xd98);
      fVar171 = *(float *)(catmullrom_basis0 + lVar25 + 0xd9c);
      fVar172 = *(float *)(catmullrom_basis0 + lVar25 + 0xda0);
      fVar173 = *(float *)(catmullrom_basis0 + lVar25 + 0xda4);
      auVar97 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar25 + 0xd8c);
      local_740 = auVar175._0_4_;
      auVar11 = vmovshdup_avx(auVar175);
      uVar110 = auVar11._0_8_;
      auVar178._0_4_ = fVar137 * local_740;
      auVar178._4_4_ = fVar168 * local_740;
      auVar178._8_4_ = fVar169 * local_740;
      auVar178._12_4_ = fVar170 * local_740;
      auVar178._16_4_ = fVar171 * local_740;
      auVar178._20_4_ = fVar172 * local_740;
      auVar178._24_4_ = fVar173 * local_740;
      auVar178._28_4_ = 0;
      fVar219 = auVar11._0_4_;
      auVar115._0_4_ = fVar219 * fVar137;
      fVar223 = auVar11._4_4_;
      auVar115._4_4_ = fVar223 * fVar168;
      auVar115._8_4_ = fVar219 * fVar169;
      auVar115._12_4_ = fVar223 * fVar170;
      auVar115._16_4_ = fVar219 * fVar171;
      auVar115._20_4_ = fVar223 * fVar172;
      auVar115._24_4_ = fVar219 * fVar173;
      auVar115._28_4_ = 0;
      auVar11 = vfmadd231ps_fma(auVar178,auVar167,local_600);
      auVar12 = vfmadd231ps_fma(auVar115,auVar167,auVar161);
      uVar109 = auVar16._0_4_;
      auVar216._4_4_ = uVar109;
      auVar216._0_4_ = uVar109;
      auVar216._8_4_ = uVar109;
      auVar216._12_4_ = uVar109;
      auVar216._16_4_ = uVar109;
      auVar216._20_4_ = uVar109;
      auVar216._24_4_ = uVar109;
      auVar216._28_4_ = uVar109;
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar124,auVar216);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar124,local_500);
      auVar122 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25);
      uVar109 = auVar15._0_4_;
      auVar158._4_4_ = uVar109;
      auVar158._0_4_ = uVar109;
      auVar158._8_4_ = uVar109;
      auVar158._12_4_ = uVar109;
      auVar158._16_4_ = uVar109;
      auVar158._20_4_ = uVar109;
      auVar158._24_4_ = uVar109;
      auVar158._28_4_ = uVar109;
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar122,auVar158);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar122,local_560);
      auVar132 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x908);
      fVar209 = *(float *)*(undefined1 (*) [28])(catmullrom_basis1 + lVar25 + 0xd8c);
      fVar214 = *(float *)(catmullrom_basis1 + lVar25 + 0xd90);
      fVar87 = *(float *)(catmullrom_basis1 + lVar25 + 0xd94);
      fVar88 = *(float *)(catmullrom_basis1 + lVar25 + 0xd98);
      fVar89 = *(float *)(catmullrom_basis1 + lVar25 + 0xd9c);
      fVar90 = *(float *)(catmullrom_basis1 + lVar25 + 0xda0);
      fVar192 = *(float *)(catmullrom_basis1 + lVar25 + 0xda4);
      auVar98 = *(undefined1 (*) [28])(catmullrom_basis1 + lVar25 + 0xd8c);
      auVar28._4_4_ = fVar214 * local_740;
      auVar28._0_4_ = fVar209 * local_740;
      auVar28._8_4_ = fVar87 * local_740;
      auVar28._12_4_ = fVar88 * local_740;
      auVar28._16_4_ = fVar89 * local_740;
      auVar28._20_4_ = fVar90 * local_740;
      auVar28._24_4_ = fVar192 * local_740;
      auVar28._28_4_ = local_740;
      auVar13 = vfmadd231ps_fma(auVar28,auVar132,local_600);
      auVar29._4_4_ = fVar223 * fVar214;
      auVar29._0_4_ = fVar219 * fVar209;
      auVar29._8_4_ = fVar219 * fVar87;
      auVar29._12_4_ = fVar223 * fVar88;
      auVar29._16_4_ = fVar219 * fVar89;
      auVar29._20_4_ = fVar223 * fVar90;
      auVar29._24_4_ = fVar219 * fVar192;
      auVar29._28_4_ = uVar206;
      auVar14 = vfmadd231ps_fma(auVar29,auVar132,auVar161);
      auVar23 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x484);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar23,auVar216);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar23,local_500);
      auVar163 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar163,auVar158);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar163,local_560);
      auVar127 = ZEXT1632(auVar13);
      auVar179 = ZEXT1632(auVar11);
      auVar125 = vsubps_avx(auVar127,auVar179);
      auVar143 = ZEXT1632(auVar14);
      auVar116 = ZEXT1632(auVar12);
      local_4a0 = vsubps_avx(auVar143,auVar116);
      auVar117._0_4_ = auVar12._0_4_ * auVar125._0_4_;
      auVar117._4_4_ = auVar12._4_4_ * auVar125._4_4_;
      auVar117._8_4_ = auVar12._8_4_ * auVar125._8_4_;
      auVar117._12_4_ = auVar12._12_4_ * auVar125._12_4_;
      auVar117._16_4_ = auVar125._16_4_ * 0.0;
      auVar117._20_4_ = auVar125._20_4_ * 0.0;
      auVar117._24_4_ = auVar125._24_4_ * 0.0;
      auVar117._28_4_ = 0;
      fVar198 = local_4a0._0_4_;
      auVar128._0_4_ = fVar198 * auVar11._0_4_;
      fVar199 = local_4a0._4_4_;
      auVar128._4_4_ = fVar199 * auVar11._4_4_;
      fVar200 = local_4a0._8_4_;
      auVar128._8_4_ = fVar200 * auVar11._8_4_;
      fVar201 = local_4a0._12_4_;
      auVar128._12_4_ = fVar201 * auVar11._12_4_;
      fVar202 = local_4a0._16_4_;
      auVar128._16_4_ = fVar202 * 0.0;
      fVar203 = local_4a0._20_4_;
      auVar128._20_4_ = fVar203 * 0.0;
      fVar218 = local_4a0._24_4_;
      auVar128._24_4_ = fVar218 * 0.0;
      auVar128._28_4_ = 0;
      auVar22 = vsubps_avx(auVar117,auVar128);
      auVar11 = vpermilps_avx(*pauVar1,0xff);
      uVar126 = auVar11._0_8_;
      local_a0._8_8_ = uVar126;
      local_a0._0_8_ = uVar126;
      local_a0._16_8_ = uVar126;
      local_a0._24_8_ = uVar126;
      auVar12 = vpermilps_avx(*pauVar2,0xff);
      uVar126 = auVar12._0_8_;
      local_c0._8_8_ = uVar126;
      local_c0._0_8_ = uVar126;
      local_c0._16_8_ = uVar126;
      local_c0._24_8_ = uVar126;
      auVar12 = vpermilps_avx(*pauVar3,0xff);
      uVar126 = auVar12._0_8_;
      local_e0._8_8_ = uVar126;
      local_e0._0_8_ = uVar126;
      local_e0._16_8_ = uVar126;
      local_e0._24_8_ = uVar126;
      auVar12 = vpermilps_avx(*pauVar4,0xff);
      local_100 = auVar12._0_8_;
      fVar138 = auVar12._0_4_;
      auVar180._0_4_ = fVar137 * fVar138;
      fVar137 = auVar12._4_4_;
      auVar180._4_4_ = fVar168 * fVar137;
      auVar180._8_4_ = fVar169 * fVar138;
      auVar180._12_4_ = fVar170 * fVar137;
      auVar180._16_4_ = fVar171 * fVar138;
      auVar180._20_4_ = fVar172 * fVar137;
      auVar180._24_4_ = fVar173 * fVar138;
      auVar180._28_4_ = 0;
      auVar12 = vfmadd231ps_fma(auVar180,local_e0,auVar167);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_c0,auVar124);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar122,local_a0);
      uStack_f8 = local_100;
      uStack_f0 = local_100;
      uStack_e8 = local_100;
      auVar30._4_4_ = fVar214 * fVar137;
      auVar30._0_4_ = fVar209 * fVar138;
      auVar30._8_4_ = fVar87 * fVar138;
      auVar30._12_4_ = fVar88 * fVar137;
      auVar30._16_4_ = fVar89 * fVar138;
      auVar30._20_4_ = fVar90 * fVar137;
      auVar30._24_4_ = fVar192 * fVar138;
      auVar30._28_4_ = auVar122._28_4_;
      auVar12 = vfmadd231ps_fma(auVar30,auVar132,local_e0);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar23,local_c0);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar163,local_a0);
      auVar31._4_4_ = fVar199 * fVar199;
      auVar31._0_4_ = fVar198 * fVar198;
      auVar31._8_4_ = fVar200 * fVar200;
      auVar31._12_4_ = fVar201 * fVar201;
      auVar31._16_4_ = fVar202 * fVar202;
      auVar31._20_4_ = fVar203 * fVar203;
      auVar31._24_4_ = fVar218 * fVar218;
      auVar31._28_4_ = auVar11._4_4_;
      auVar11 = vfmadd231ps_fma(auVar31,auVar125,auVar125);
      auVar24 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar14));
      auVar32._4_4_ = auVar24._4_4_ * auVar24._4_4_ * auVar11._4_4_;
      auVar32._0_4_ = auVar24._0_4_ * auVar24._0_4_ * auVar11._0_4_;
      auVar32._8_4_ = auVar24._8_4_ * auVar24._8_4_ * auVar11._8_4_;
      auVar32._12_4_ = auVar24._12_4_ * auVar24._12_4_ * auVar11._12_4_;
      auVar32._16_4_ = auVar24._16_4_ * auVar24._16_4_ * 0.0;
      auVar32._20_4_ = auVar24._20_4_ * auVar24._20_4_ * 0.0;
      auVar32._24_4_ = auVar24._24_4_ * auVar24._24_4_ * 0.0;
      auVar32._28_4_ = auVar24._28_4_;
      auVar33._4_4_ = auVar22._4_4_ * auVar22._4_4_;
      auVar33._0_4_ = auVar22._0_4_ * auVar22._0_4_;
      auVar33._8_4_ = auVar22._8_4_ * auVar22._8_4_;
      auVar33._12_4_ = auVar22._12_4_ * auVar22._12_4_;
      auVar33._16_4_ = auVar22._16_4_ * auVar22._16_4_;
      auVar33._20_4_ = auVar22._20_4_ * auVar22._20_4_;
      auVar33._24_4_ = auVar22._24_4_ * auVar22._24_4_;
      auVar33._28_4_ = auVar22._28_4_;
      auVar24 = vcmpps_avx(auVar33,auVar32,2);
      fVar138 = auVar10._0_4_ * 4.7683716e-07;
      auVar118._0_4_ = (float)iVar100;
      local_520._4_12_ = auVar111._4_12_;
      local_520._0_4_ = auVar118._0_4_;
      local_520._16_16_ = auVar114._16_16_;
      auVar118._4_4_ = auVar118._0_4_;
      auVar118._8_4_ = auVar118._0_4_;
      auVar118._12_4_ = auVar118._0_4_;
      auVar118._16_4_ = auVar118._0_4_;
      auVar118._20_4_ = auVar118._0_4_;
      auVar118._24_4_ = auVar118._0_4_;
      auVar118._28_4_ = auVar118._0_4_;
      auVar114 = vcmpps_avx(_DAT_02020f40,auVar118,1);
      auVar10 = vpermilps_avx(auVar15,0xaa);
      uVar126 = auVar10._0_8_;
      local_620._8_8_ = uVar126;
      local_620._0_8_ = uVar126;
      local_620._16_8_ = uVar126;
      local_620._24_8_ = uVar126;
      auVar12 = vpermilps_avx(auVar16,0xaa);
      uVar126 = auVar12._0_8_;
      auVar222._8_8_ = uVar126;
      auVar222._0_8_ = uVar126;
      auVar222._16_8_ = uVar126;
      auVar222._24_8_ = uVar126;
      auVar10 = vshufps_avx(auVar111,auVar111,0xaa);
      uVar126 = auVar10._0_8_;
      auVar208._8_8_ = uVar126;
      auVar208._0_8_ = uVar126;
      auVar208._16_8_ = uVar126;
      auVar208._24_8_ = uVar126;
      auVar11 = vshufps_avx(auVar175,auVar175,0xaa);
      uVar126 = auVar11._0_8_;
      register0x00001508 = uVar126;
      local_720 = uVar126;
      register0x00001510 = uVar126;
      register0x00001518 = uVar126;
      auVar212 = ZEXT3264(_local_720);
      auVar22 = auVar114 & auVar24;
      uVar109 = *(undefined4 *)(ray + k * 4 + 0x60);
      fStack_73c = local_740;
      fStack_738 = local_740;
      fStack_734 = local_740;
      fStack_730 = local_740;
      fStack_72c = local_740;
      fStack_728 = local_740;
      fStack_724 = local_740;
      if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar22 >> 0x7f,0) == '\0') &&
            (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar22 >> 0xbf,0) == '\0') &&
          (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar22[0x1f])
      {
        bVar107 = false;
        auVar196 = ZEXT3264(CONCAT428(local_740,
                                      CONCAT424(local_740,
                                                CONCAT420(local_740,
                                                          CONCAT416(local_740,
                                                                    CONCAT412(local_740,
                                                                              CONCAT48(local_740,
                                                                                       CONCAT44(
                                                  local_740,local_740))))))));
        auVar135 = ZEXT3264(CONCAT428(fVar223,CONCAT424(fVar219,CONCAT420(fVar223,CONCAT416(fVar219,
                                                  CONCAT412(fVar223,CONCAT48(fVar219,uVar110)))))));
      }
      else {
        auVar24 = vandps_avx(auVar24,auVar114);
        local_660._0_4_ = auVar98._0_4_;
        local_660._4_4_ = auVar98._4_4_;
        fStack_658 = auVar98._8_4_;
        fStack_654 = auVar98._12_4_;
        fStack_650 = auVar98._16_4_;
        fStack_64c = auVar98._20_4_;
        fStack_648 = auVar98._24_4_;
        fVar209 = auVar11._0_4_;
        fVar214 = auVar11._4_4_;
        auVar34._4_4_ = fVar214 * (float)local_660._4_4_;
        auVar34._0_4_ = fVar209 * (float)local_660._0_4_;
        auVar34._8_4_ = fVar209 * fStack_658;
        auVar34._12_4_ = fVar214 * fStack_654;
        auVar34._16_4_ = fVar209 * fStack_650;
        auVar34._20_4_ = fVar214 * fStack_64c;
        auVar34._24_4_ = fVar209 * fStack_648;
        auVar34._28_4_ = auVar24._28_4_;
        auVar11 = vfmadd213ps_fma(auVar132,auVar208,auVar34);
        auVar11 = vfmadd213ps_fma(auVar23,auVar222,ZEXT1632(auVar11));
        auVar11 = vfmadd213ps_fma(auVar163,local_620,ZEXT1632(auVar11));
        local_700._0_4_ = auVar97._0_4_;
        local_700._4_4_ = auVar97._4_4_;
        uStack_6f8._0_4_ = auVar97._8_4_;
        uStack_6f8._4_4_ = auVar97._12_4_;
        auStack_6f0._0_4_ = auVar97._16_4_;
        auStack_6f0._4_4_ = auVar97._20_4_;
        fStack_6e8 = auVar97._24_4_;
        auVar35._4_4_ = fVar214 * (float)local_700._4_4_;
        auVar35._0_4_ = fVar209 * (float)local_700._0_4_;
        auVar35._8_4_ = fVar209 * (float)uStack_6f8;
        auVar35._12_4_ = fVar214 * uStack_6f8._4_4_;
        auVar35._16_4_ = fVar209 * (float)auStack_6f0._0_4_;
        auVar35._20_4_ = fVar214 * (float)auStack_6f0._4_4_;
        auVar35._24_4_ = fVar209 * fStack_6e8;
        auVar35._28_4_ = auVar24._28_4_;
        auVar15 = vfmadd213ps_fma(auVar167,auVar208,auVar35);
        auVar15 = vfmadd213ps_fma(auVar124,auVar222,ZEXT1632(auVar15));
        auVar114 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1210);
        auVar124 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1694);
        auVar167 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1b18);
        fVar137 = *(float *)(catmullrom_basis0 + lVar25 + 0x1f9c);
        fVar168 = *(float *)(catmullrom_basis0 + lVar25 + 0x1fa0);
        fVar169 = *(float *)(catmullrom_basis0 + lVar25 + 0x1fa4);
        fVar170 = *(float *)(catmullrom_basis0 + lVar25 + 0x1fa8);
        fVar171 = *(float *)(catmullrom_basis0 + lVar25 + 0x1fac);
        fVar172 = *(float *)(catmullrom_basis0 + lVar25 + 0x1fb0);
        fVar173 = *(float *)(catmullrom_basis0 + lVar25 + 0x1fb4);
        auVar162._0_4_ = local_740 * fVar137;
        auVar162._4_4_ = local_740 * fVar168;
        auVar162._8_4_ = local_740 * fVar169;
        auVar162._12_4_ = local_740 * fVar170;
        auVar162._16_4_ = local_740 * fVar171;
        auVar162._20_4_ = local_740 * fVar172;
        auVar162._24_4_ = local_740 * fVar173;
        auVar162._28_4_ = 0;
        auVar190._0_4_ = fVar219 * fVar137;
        auVar190._4_4_ = fVar223 * fVar168;
        auVar190._8_4_ = fVar219 * fVar169;
        auVar190._12_4_ = fVar223 * fVar170;
        auVar190._16_4_ = fVar219 * fVar171;
        auVar190._20_4_ = fVar223 * fVar172;
        auVar190._24_4_ = fVar219 * fVar173;
        auVar190._28_4_ = 0;
        auVar36._4_4_ = fVar214 * fVar168;
        auVar36._0_4_ = fVar209 * fVar137;
        auVar36._8_4_ = fVar209 * fVar169;
        auVar36._12_4_ = fVar214 * fVar170;
        auVar36._16_4_ = fVar209 * fVar171;
        auVar36._20_4_ = fVar214 * fVar172;
        auVar36._24_4_ = fVar209 * fVar173;
        auVar36._28_4_ = fVar214;
        auVar16 = vfmadd231ps_fma(auVar162,auVar167,local_600);
        auVar111 = vfmadd231ps_fma(auVar190,auVar167,auVar161);
        auVar175 = vfmadd231ps_fma(auVar36,auVar208,auVar167);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar124,auVar216);
        auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar124,local_500);
        auVar175 = vfmadd231ps_fma(ZEXT1632(auVar175),auVar222,auVar124);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar114,auVar158);
        auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar114,local_560);
        auVar175 = vfmadd231ps_fma(ZEXT1632(auVar175),auVar114,local_620);
        fVar137 = *(float *)(catmullrom_basis1 + lVar25 + 0x1f9c);
        fVar168 = *(float *)(catmullrom_basis1 + lVar25 + 0x1fa0);
        fVar169 = *(float *)(catmullrom_basis1 + lVar25 + 0x1fa4);
        fVar170 = *(float *)(catmullrom_basis1 + lVar25 + 0x1fa8);
        fVar171 = *(float *)(catmullrom_basis1 + lVar25 + 0x1fac);
        fVar172 = *(float *)(catmullrom_basis1 + lVar25 + 0x1fb0);
        fVar173 = *(float *)(catmullrom_basis1 + lVar25 + 0x1fb4);
        auVar37._4_4_ = local_740 * fVar168;
        auVar37._0_4_ = local_740 * fVar137;
        auVar37._8_4_ = local_740 * fVar169;
        auVar37._12_4_ = local_740 * fVar170;
        auVar37._16_4_ = local_740 * fVar171;
        auVar37._20_4_ = local_740 * fVar172;
        auVar37._24_4_ = local_740 * fVar173;
        auVar37._28_4_ = auVar12._4_4_;
        auVar38._4_4_ = fVar223 * fVar168;
        auVar38._0_4_ = fVar219 * fVar137;
        auVar38._8_4_ = fVar219 * fVar169;
        auVar38._12_4_ = fVar223 * fVar170;
        auVar38._16_4_ = fVar219 * fVar171;
        auVar38._20_4_ = fVar223 * fVar172;
        auVar38._24_4_ = fVar219 * fVar173;
        auVar38._28_4_ = local_740;
        auVar39._4_4_ = fVar168 * fVar214;
        auVar39._0_4_ = fVar137 * fVar209;
        auVar39._8_4_ = fVar169 * fVar209;
        auVar39._12_4_ = fVar170 * fVar214;
        auVar39._16_4_ = fVar171 * fVar209;
        auVar39._20_4_ = fVar172 * fVar214;
        auVar39._24_4_ = fVar173 * fVar209;
        auVar39._28_4_ = auVar10._4_4_;
        auVar114 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1b18);
        auVar10 = vfmadd231ps_fma(auVar37,auVar114,local_600);
        auVar27 = vfmadd231ps_fma(auVar38,auVar114,auVar161);
        auVar153 = vfmadd231ps_fma(auVar39,auVar208,auVar114);
        auVar114 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1694);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar114,auVar216);
        auVar27 = vfmadd231ps_fma(ZEXT1632(auVar27),auVar114,local_500);
        auVar153 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar114,auVar222);
        auVar114 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1210);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar114,auVar158);
        auVar27 = vfmadd231ps_fma(ZEXT1632(auVar27),auVar114,local_560);
        auVar153 = vfmadd231ps_fma(ZEXT1632(auVar153),local_620,auVar114);
        auVar114 = vandps_avx(local_2c0,ZEXT1632(auVar16));
        auVar124 = vandps_avx(ZEXT1632(auVar111),local_2c0);
        auVar124 = vmaxps_avx(auVar114,auVar124);
        auVar114 = vandps_avx(ZEXT1632(auVar175),local_2c0);
        auVar114 = vmaxps_avx(auVar124,auVar114);
        auVar129._4_4_ = fVar138;
        auVar129._0_4_ = fVar138;
        auVar129._8_4_ = fVar138;
        auVar129._12_4_ = fVar138;
        auVar129._16_4_ = fVar138;
        auVar129._20_4_ = fVar138;
        auVar129._24_4_ = fVar138;
        auVar129._28_4_ = fVar138;
        auVar114 = vcmpps_avx(auVar114,auVar129,1);
        auVar167 = vblendvps_avx(ZEXT1632(auVar16),auVar125,auVar114);
        auVar132 = vblendvps_avx(ZEXT1632(auVar111),local_4a0,auVar114);
        auVar114 = vandps_avx(ZEXT1632(auVar10),local_2c0);
        auVar124 = vandps_avx(ZEXT1632(auVar27),local_2c0);
        auVar124 = vmaxps_avx(auVar114,auVar124);
        auVar114 = vandps_avx(ZEXT1632(auVar153),local_2c0);
        auVar114 = vmaxps_avx(auVar124,auVar114);
        auVar124 = vcmpps_avx(auVar114,auVar129,1);
        auVar114 = vblendvps_avx(ZEXT1632(auVar10),auVar125,auVar124);
        auVar124 = vblendvps_avx(ZEXT1632(auVar27),local_4a0,auVar124);
        auVar10 = vfmadd213ps_fma(auVar122,local_620,ZEXT1632(auVar15));
        auVar15 = vfmadd213ps_fma(auVar167,auVar167,ZEXT832(0) << 0x20);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar132,auVar132);
        auVar122 = vrsqrtps_avx(ZEXT1632(auVar15));
        fVar137 = auVar122._0_4_;
        fVar168 = auVar122._4_4_;
        fVar169 = auVar122._8_4_;
        fVar170 = auVar122._12_4_;
        fVar171 = auVar122._16_4_;
        fVar172 = auVar122._20_4_;
        fVar173 = auVar122._24_4_;
        auVar40._4_4_ = fVar168 * fVar168 * fVar168 * auVar15._4_4_ * -0.5;
        auVar40._0_4_ = fVar137 * fVar137 * fVar137 * auVar15._0_4_ * -0.5;
        auVar40._8_4_ = fVar169 * fVar169 * fVar169 * auVar15._8_4_ * -0.5;
        auVar40._12_4_ = fVar170 * fVar170 * fVar170 * auVar15._12_4_ * -0.5;
        auVar40._16_4_ = fVar171 * fVar171 * fVar171 * -0.0;
        auVar40._20_4_ = fVar172 * fVar172 * fVar172 * -0.0;
        auVar40._24_4_ = fVar173 * fVar173 * fVar173 * -0.0;
        auVar40._28_4_ = 0;
        auVar217._8_4_ = 0x3fc00000;
        auVar217._0_8_ = 0x3fc000003fc00000;
        auVar217._12_4_ = 0x3fc00000;
        auVar217._16_4_ = 0x3fc00000;
        auVar217._20_4_ = 0x3fc00000;
        auVar217._24_4_ = 0x3fc00000;
        auVar217._28_4_ = 0x3fc00000;
        auVar15 = vfmadd231ps_fma(auVar40,auVar217,auVar122);
        fVar137 = auVar15._0_4_;
        fVar168 = auVar15._4_4_;
        auVar41._4_4_ = auVar132._4_4_ * fVar168;
        auVar41._0_4_ = auVar132._0_4_ * fVar137;
        fVar169 = auVar15._8_4_;
        auVar41._8_4_ = auVar132._8_4_ * fVar169;
        fVar170 = auVar15._12_4_;
        auVar41._12_4_ = auVar132._12_4_ * fVar170;
        auVar41._16_4_ = auVar132._16_4_ * 0.0;
        auVar41._20_4_ = auVar132._20_4_ * 0.0;
        auVar41._24_4_ = auVar132._24_4_ * 0.0;
        auVar41._28_4_ = auVar122._28_4_;
        auVar42._4_4_ = -auVar167._4_4_ * fVar168;
        auVar42._0_4_ = -auVar167._0_4_ * fVar137;
        auVar42._8_4_ = -auVar167._8_4_ * fVar169;
        auVar42._12_4_ = -auVar167._12_4_ * fVar170;
        auVar42._16_4_ = -auVar167._16_4_ * 0.0;
        auVar42._20_4_ = -auVar167._20_4_ * 0.0;
        auVar42._24_4_ = -auVar167._24_4_ * 0.0;
        auVar42._28_4_ = auVar167._28_4_ ^ 0x80000000;
        auVar15 = vfmadd213ps_fma(auVar114,auVar114,ZEXT832(0) << 0x20);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar124,auVar124);
        auVar167 = vrsqrtps_avx(ZEXT1632(auVar15));
        auVar122 = ZEXT1632(CONCAT412(fVar170 * 0.0,
                                      CONCAT48(fVar169 * 0.0,CONCAT44(fVar168 * 0.0,fVar137 * 0.0)))
                           );
        fVar137 = auVar167._0_4_;
        fVar168 = auVar167._4_4_;
        fVar169 = auVar167._8_4_;
        fVar170 = auVar167._12_4_;
        fVar171 = auVar167._16_4_;
        fVar172 = auVar167._20_4_;
        fVar173 = auVar167._24_4_;
        auVar43._4_4_ = fVar168 * fVar168 * auVar15._4_4_ * -0.5 * fVar168;
        auVar43._0_4_ = fVar137 * fVar137 * auVar15._0_4_ * -0.5 * fVar137;
        auVar43._8_4_ = fVar169 * fVar169 * auVar15._8_4_ * -0.5 * fVar169;
        auVar43._12_4_ = fVar170 * fVar170 * auVar15._12_4_ * -0.5 * fVar170;
        auVar43._16_4_ = fVar171 * fVar171 * fVar171 * -0.0;
        auVar43._20_4_ = fVar172 * fVar172 * fVar172 * -0.0;
        auVar43._24_4_ = fVar173 * fVar173 * fVar173 * -0.0;
        auVar43._28_4_ = 0xbf000000;
        auVar15 = vfmadd231ps_fma(auVar43,auVar217,auVar167);
        fVar137 = auVar15._0_4_;
        fVar168 = auVar15._4_4_;
        auVar44._4_4_ = fVar168 * auVar124._4_4_;
        auVar44._0_4_ = fVar137 * auVar124._0_4_;
        fVar169 = auVar15._8_4_;
        auVar44._8_4_ = fVar169 * auVar124._8_4_;
        fVar170 = auVar15._12_4_;
        auVar44._12_4_ = fVar170 * auVar124._12_4_;
        auVar44._16_4_ = auVar124._16_4_ * 0.0;
        auVar44._20_4_ = auVar124._20_4_ * 0.0;
        auVar44._24_4_ = auVar124._24_4_ * 0.0;
        auVar44._28_4_ = local_4a0._28_4_;
        auVar45._4_4_ = fVar168 * -auVar114._4_4_;
        auVar45._0_4_ = fVar137 * -auVar114._0_4_;
        auVar45._8_4_ = fVar169 * -auVar114._8_4_;
        auVar45._12_4_ = fVar170 * -auVar114._12_4_;
        auVar45._16_4_ = -auVar114._16_4_ * 0.0;
        auVar45._20_4_ = -auVar114._20_4_ * 0.0;
        auVar45._24_4_ = -auVar114._24_4_ * 0.0;
        auVar45._28_4_ = 0;
        auVar46._28_4_ = auVar167._28_4_;
        auVar46._0_28_ =
             ZEXT1628(CONCAT412(fVar170 * 0.0,
                                CONCAT48(fVar169 * 0.0,CONCAT44(fVar168 * 0.0,fVar137 * 0.0))));
        auVar15 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar13),auVar179);
        auVar114 = ZEXT1632(auVar13);
        auVar16 = vfmadd213ps_fma(auVar42,auVar114,auVar116);
        auVar111 = vfmadd213ps_fma(auVar122,auVar114,ZEXT1632(auVar10));
        auVar153 = vfnmadd213ps_fma(auVar41,auVar114,auVar179);
        auVar175 = vfmadd213ps_fma(auVar44,ZEXT1632(auVar14),auVar127);
        auVar176 = vfnmadd213ps_fma(auVar42,auVar114,auVar116);
        auVar114 = ZEXT1632(auVar14);
        auVar27 = vfmadd213ps_fma(auVar45,auVar114,auVar143);
        auVar181 = ZEXT1632(auVar13);
        auVar188 = vfnmadd231ps_fma(ZEXT1632(auVar10),auVar181,auVar122);
        auVar13 = vfmadd213ps_fma(auVar46,auVar114,ZEXT1632(auVar11));
        auVar177 = vfnmadd213ps_fma(auVar44,auVar114,auVar127);
        auVar187 = vfnmadd213ps_fma(auVar45,auVar114,auVar143);
        auVar204 = vfnmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar14),auVar46);
        auVar114 = vsubps_avx(ZEXT1632(auVar27),ZEXT1632(auVar176));
        auVar124 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar188));
        auVar144._0_4_ = auVar188._0_4_ * auVar114._0_4_;
        auVar144._4_4_ = auVar188._4_4_ * auVar114._4_4_;
        auVar144._8_4_ = auVar188._8_4_ * auVar114._8_4_;
        auVar144._12_4_ = auVar188._12_4_ * auVar114._12_4_;
        auVar144._16_4_ = auVar114._16_4_ * 0.0;
        auVar144._20_4_ = auVar114._20_4_ * 0.0;
        auVar144._24_4_ = auVar114._24_4_ * 0.0;
        auVar144._28_4_ = 0;
        auVar11 = vfmsub231ps_fma(auVar144,ZEXT1632(auVar176),auVar124);
        auVar47._4_4_ = auVar124._4_4_ * auVar153._4_4_;
        auVar47._0_4_ = auVar124._0_4_ * auVar153._0_4_;
        auVar47._8_4_ = auVar124._8_4_ * auVar153._8_4_;
        auVar47._12_4_ = auVar124._12_4_ * auVar153._12_4_;
        auVar47._16_4_ = auVar124._16_4_ * 0.0;
        auVar47._20_4_ = auVar124._20_4_ * 0.0;
        auVar47._24_4_ = auVar124._24_4_ * 0.0;
        auVar47._28_4_ = auVar124._28_4_;
        auVar124 = vsubps_avx(ZEXT1632(auVar175),ZEXT1632(auVar153));
        auVar10 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar188),auVar124);
        auVar48._4_4_ = auVar176._4_4_ * auVar124._4_4_;
        auVar48._0_4_ = auVar176._0_4_ * auVar124._0_4_;
        auVar48._8_4_ = auVar176._8_4_ * auVar124._8_4_;
        auVar48._12_4_ = auVar176._12_4_ * auVar124._12_4_;
        auVar48._16_4_ = auVar124._16_4_ * 0.0;
        auVar48._20_4_ = auVar124._20_4_ * 0.0;
        auVar48._24_4_ = auVar124._24_4_ * 0.0;
        auVar48._28_4_ = auVar124._28_4_;
        auVar163 = ZEXT1632(auVar153);
        auVar153 = vfmsub231ps_fma(auVar48,auVar163,auVar114);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar153),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
        auVar127 = vcmpps_avx(ZEXT1632(auVar10),ZEXT832(0) << 0x20,2);
        auVar114 = vblendvps_avx(ZEXT1632(auVar177),ZEXT1632(auVar15),auVar127);
        auVar124 = vblendvps_avx(ZEXT1632(auVar187),ZEXT1632(auVar16),auVar127);
        auVar167 = vblendvps_avx(ZEXT1632(auVar204),ZEXT1632(auVar111),auVar127);
        auVar122 = vblendvps_avx(auVar163,ZEXT1632(auVar175),auVar127);
        auVar132 = vblendvps_avx(ZEXT1632(auVar176),ZEXT1632(auVar27),auVar127);
        auVar23 = vblendvps_avx(ZEXT1632(auVar188),ZEXT1632(auVar13),auVar127);
        auVar163 = vblendvps_avx(ZEXT1632(auVar175),auVar163,auVar127);
        auVar22 = vblendvps_avx(ZEXT1632(auVar27),ZEXT1632(auVar176),auVar127);
        auVar10 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
        auVar116 = vblendvps_avx(ZEXT1632(auVar13),ZEXT1632(auVar188),auVar127);
        auVar143 = vsubps_avx(auVar163,auVar114);
        auVar179 = vsubps_avx(auVar22,auVar124);
        auVar184 = vsubps_avx(auVar116,auVar167);
        auVar189 = vsubps_avx(auVar114,auVar122);
        auVar193 = vsubps_avx(auVar124,auVar132);
        auVar215 = vsubps_avx(auVar167,auVar23);
        auVar49._4_4_ = auVar184._4_4_ * auVar114._4_4_;
        auVar49._0_4_ = auVar184._0_4_ * auVar114._0_4_;
        auVar49._8_4_ = auVar184._8_4_ * auVar114._8_4_;
        auVar49._12_4_ = auVar184._12_4_ * auVar114._12_4_;
        auVar49._16_4_ = auVar184._16_4_ * auVar114._16_4_;
        auVar49._20_4_ = auVar184._20_4_ * auVar114._20_4_;
        auVar49._24_4_ = auVar184._24_4_ * auVar114._24_4_;
        auVar49._28_4_ = auVar116._28_4_;
        auVar11 = vfmsub231ps_fma(auVar49,auVar167,auVar143);
        auVar50._4_4_ = auVar124._4_4_ * auVar143._4_4_;
        auVar50._0_4_ = auVar124._0_4_ * auVar143._0_4_;
        auVar50._8_4_ = auVar124._8_4_ * auVar143._8_4_;
        auVar50._12_4_ = auVar124._12_4_ * auVar143._12_4_;
        auVar50._16_4_ = auVar124._16_4_ * auVar143._16_4_;
        auVar50._20_4_ = auVar124._20_4_ * auVar143._20_4_;
        auVar50._24_4_ = auVar124._24_4_ * auVar143._24_4_;
        auVar50._28_4_ = auVar163._28_4_;
        auVar13 = vfmsub231ps_fma(auVar50,auVar114,auVar179);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
        auVar119._0_4_ = auVar179._0_4_ * auVar167._0_4_;
        auVar119._4_4_ = auVar179._4_4_ * auVar167._4_4_;
        auVar119._8_4_ = auVar179._8_4_ * auVar167._8_4_;
        auVar119._12_4_ = auVar179._12_4_ * auVar167._12_4_;
        auVar119._16_4_ = auVar179._16_4_ * auVar167._16_4_;
        auVar119._20_4_ = auVar179._20_4_ * auVar167._20_4_;
        auVar119._24_4_ = auVar179._24_4_ * auVar167._24_4_;
        auVar119._28_4_ = 0;
        auVar13 = vfmsub231ps_fma(auVar119,auVar124,auVar184);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
        auVar120._0_4_ = auVar215._0_4_ * auVar122._0_4_;
        auVar120._4_4_ = auVar215._4_4_ * auVar122._4_4_;
        auVar120._8_4_ = auVar215._8_4_ * auVar122._8_4_;
        auVar120._12_4_ = auVar215._12_4_ * auVar122._12_4_;
        auVar120._16_4_ = auVar215._16_4_ * auVar122._16_4_;
        auVar120._20_4_ = auVar215._20_4_ * auVar122._20_4_;
        auVar120._24_4_ = auVar215._24_4_ * auVar122._24_4_;
        auVar120._28_4_ = 0;
        auVar11 = vfmsub231ps_fma(auVar120,auVar189,auVar23);
        auVar51._4_4_ = auVar193._4_4_ * auVar23._4_4_;
        auVar51._0_4_ = auVar193._0_4_ * auVar23._0_4_;
        auVar51._8_4_ = auVar193._8_4_ * auVar23._8_4_;
        auVar51._12_4_ = auVar193._12_4_ * auVar23._12_4_;
        auVar51._16_4_ = auVar193._16_4_ * auVar23._16_4_;
        auVar51._20_4_ = auVar193._20_4_ * auVar23._20_4_;
        auVar51._24_4_ = auVar193._24_4_ * auVar23._24_4_;
        auVar51._28_4_ = auVar23._28_4_;
        auVar15 = vfmsub231ps_fma(auVar51,auVar132,auVar215);
        auVar52._4_4_ = auVar189._4_4_ * auVar132._4_4_;
        auVar52._0_4_ = auVar189._0_4_ * auVar132._0_4_;
        auVar52._8_4_ = auVar189._8_4_ * auVar132._8_4_;
        auVar52._12_4_ = auVar189._12_4_ * auVar132._12_4_;
        auVar52._16_4_ = auVar189._16_4_ * auVar132._16_4_;
        auVar52._20_4_ = auVar189._20_4_ * auVar132._20_4_;
        auVar52._24_4_ = auVar189._24_4_ * auVar132._24_4_;
        auVar52._28_4_ = auVar22._28_4_;
        auVar16 = vfmsub231ps_fma(auVar52,auVar193,auVar122);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
        auVar122 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar15));
        auVar122 = vcmpps_avx(auVar122,ZEXT832(0) << 0x20,2);
        auVar11 = vpackssdw_avx(auVar122._0_16_,auVar122._16_16_);
        auVar10 = vpand_avx(auVar11,auVar10);
        auVar122 = vpmovsxwd_avx2(auVar10);
        if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar122 >> 0x7f,0) == '\0') &&
              (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar122 >> 0xbf,0) == '\0') &&
            (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar122[0x1f]) {
LAB_018afab5:
          auVar135 = ZEXT3264(CONCAT824(uStack_588,
                                        CONCAT816(uStack_590,CONCAT88(uStack_598,local_5a0))));
        }
        else {
          auVar53._4_4_ = auVar179._4_4_ * auVar215._4_4_;
          auVar53._0_4_ = auVar179._0_4_ * auVar215._0_4_;
          auVar53._8_4_ = auVar179._8_4_ * auVar215._8_4_;
          auVar53._12_4_ = auVar179._12_4_ * auVar215._12_4_;
          auVar53._16_4_ = auVar179._16_4_ * auVar215._16_4_;
          auVar53._20_4_ = auVar179._20_4_ * auVar215._20_4_;
          auVar53._24_4_ = auVar179._24_4_ * auVar215._24_4_;
          auVar53._28_4_ = auVar122._28_4_;
          auVar175 = vfmsub231ps_fma(auVar53,auVar193,auVar184);
          auVar130._0_4_ = auVar184._0_4_ * auVar189._0_4_;
          auVar130._4_4_ = auVar184._4_4_ * auVar189._4_4_;
          auVar130._8_4_ = auVar184._8_4_ * auVar189._8_4_;
          auVar130._12_4_ = auVar184._12_4_ * auVar189._12_4_;
          auVar130._16_4_ = auVar184._16_4_ * auVar189._16_4_;
          auVar130._20_4_ = auVar184._20_4_ * auVar189._20_4_;
          auVar130._24_4_ = auVar184._24_4_ * auVar189._24_4_;
          auVar130._28_4_ = 0;
          auVar111 = vfmsub231ps_fma(auVar130,auVar143,auVar215);
          auVar54._4_4_ = auVar193._4_4_ * auVar143._4_4_;
          auVar54._0_4_ = auVar193._0_4_ * auVar143._0_4_;
          auVar54._8_4_ = auVar193._8_4_ * auVar143._8_4_;
          auVar54._12_4_ = auVar193._12_4_ * auVar143._12_4_;
          auVar54._16_4_ = auVar193._16_4_ * auVar143._16_4_;
          auVar54._20_4_ = auVar193._20_4_ * auVar143._20_4_;
          auVar54._24_4_ = auVar193._24_4_ * auVar143._24_4_;
          auVar54._28_4_ = auVar132._28_4_;
          auVar27 = vfmsub231ps_fma(auVar54,auVar189,auVar179);
          auVar11 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar111),ZEXT1632(auVar27));
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar175),ZEXT832(0) << 0x20);
          auVar122 = vrcpps_avx(ZEXT1632(auVar16));
          auVar205._8_4_ = 0x3f800000;
          auVar205._0_8_ = &DAT_3f8000003f800000;
          auVar205._12_4_ = 0x3f800000;
          auVar205._16_4_ = 0x3f800000;
          auVar205._20_4_ = 0x3f800000;
          auVar205._24_4_ = 0x3f800000;
          auVar205._28_4_ = 0x3f800000;
          auVar11 = vfnmadd213ps_fma(auVar122,ZEXT1632(auVar16),auVar205);
          auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar122,auVar122);
          auVar182._0_4_ = auVar27._0_4_ * auVar167._0_4_;
          auVar182._4_4_ = auVar27._4_4_ * auVar167._4_4_;
          auVar182._8_4_ = auVar27._8_4_ * auVar167._8_4_;
          auVar182._12_4_ = auVar27._12_4_ * auVar167._12_4_;
          auVar182._16_4_ = auVar167._16_4_ * 0.0;
          auVar182._20_4_ = auVar167._20_4_ * 0.0;
          auVar182._24_4_ = auVar167._24_4_ * 0.0;
          auVar182._28_4_ = 0;
          auVar111 = vfmadd231ps_fma(auVar182,auVar124,ZEXT1632(auVar111));
          auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),ZEXT1632(auVar175),auVar114);
          fVar137 = auVar11._0_4_;
          fVar168 = auVar11._4_4_;
          fVar169 = auVar11._8_4_;
          fVar170 = auVar11._12_4_;
          auVar167 = ZEXT1632(CONCAT412(fVar170 * auVar111._12_4_,
                                        CONCAT48(fVar169 * auVar111._8_4_,
                                                 CONCAT44(fVar168 * auVar111._4_4_,
                                                          fVar137 * auVar111._0_4_))));
          auVar121._4_4_ = uVar109;
          auVar121._0_4_ = uVar109;
          auVar121._8_4_ = uVar109;
          auVar121._12_4_ = uVar109;
          auVar121._16_4_ = uVar109;
          auVar121._20_4_ = uVar109;
          auVar121._24_4_ = uVar109;
          auVar121._28_4_ = uVar109;
          uVar206 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar131._4_4_ = uVar206;
          auVar131._0_4_ = uVar206;
          auVar131._8_4_ = uVar206;
          auVar131._12_4_ = uVar206;
          auVar131._16_4_ = uVar206;
          auVar131._20_4_ = uVar206;
          auVar131._24_4_ = uVar206;
          auVar131._28_4_ = uVar206;
          auVar114 = vcmpps_avx(auVar121,auVar167,2);
          auVar124 = vcmpps_avx(auVar167,auVar131,2);
          auVar114 = vandps_avx(auVar124,auVar114);
          auVar11 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
          auVar10 = vpand_avx(auVar10,auVar11);
          auVar114 = vpmovsxwd_avx2(auVar10);
          if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar114 >> 0x7f,0) == '\0') &&
                (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar114 >> 0xbf,0) == '\0') &&
              (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar114[0x1f]) goto LAB_018afab5;
          auVar114 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar16),4);
          auVar11 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
          auVar10 = vpand_avx(auVar10,auVar11);
          auVar114 = vpmovsxwd_avx2(auVar10);
          auVar135 = ZEXT3264(CONCAT824(uStack_588,
                                        CONCAT816(uStack_590,CONCAT88(uStack_598,local_5a0))));
          if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar114 >> 0x7f,0) != '\0') ||
                (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar114 >> 0xbf,0) != '\0') ||
              (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar114[0x1f] < '\0') {
            auVar122 = ZEXT1632(CONCAT412(fVar170 * auVar13._12_4_,
                                          CONCAT48(fVar169 * auVar13._8_4_,
                                                   CONCAT44(fVar168 * auVar13._4_4_,
                                                            fVar137 * auVar13._0_4_))));
            auVar132 = ZEXT1632(CONCAT412(fVar170 * auVar15._12_4_,
                                          CONCAT48(fVar169 * auVar15._8_4_,
                                                   CONCAT44(fVar168 * auVar15._4_4_,
                                                            fVar137 * auVar15._0_4_))));
            auVar159._8_4_ = 0x3f800000;
            auVar159._0_8_ = &DAT_3f8000003f800000;
            auVar159._12_4_ = 0x3f800000;
            auVar159._16_4_ = 0x3f800000;
            auVar159._20_4_ = 0x3f800000;
            auVar159._24_4_ = 0x3f800000;
            auVar159._28_4_ = 0x3f800000;
            auVar124 = vsubps_avx(auVar159,auVar122);
            local_120 = vblendvps_avx(auVar124,auVar122,auVar127);
            auVar124 = vsubps_avx(auVar159,auVar132);
            local_4c0 = vblendvps_avx(auVar124,auVar132,auVar127);
            auVar135 = ZEXT3264(auVar114);
            local_2a0 = auVar167;
          }
        }
        auVar212 = ZEXT3264(_local_720);
        auVar152 = ZEXT3264(auVar208);
        auVar114 = auVar135._0_32_;
        if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar114 >> 0x7f,0) != '\0') ||
              (auVar135 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar114 >> 0xbf,0) != '\0') ||
            (auVar135 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar135[0x1f] < '\0') {
          auVar124 = vsubps_avx(ZEXT1632(auVar14),auVar181);
          auVar10 = vfmadd213ps_fma(auVar124,local_120,auVar181);
          fVar137 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar55._4_4_ = (auVar10._4_4_ + auVar10._4_4_) * fVar137;
          auVar55._0_4_ = (auVar10._0_4_ + auVar10._0_4_) * fVar137;
          auVar55._8_4_ = (auVar10._8_4_ + auVar10._8_4_) * fVar137;
          auVar55._12_4_ = (auVar10._12_4_ + auVar10._12_4_) * fVar137;
          auVar55._16_4_ = fVar137 * 0.0;
          auVar55._20_4_ = fVar137 * 0.0;
          auVar55._24_4_ = fVar137 * 0.0;
          auVar55._28_4_ = 0;
          auVar124 = vcmpps_avx(local_2a0,auVar55,6);
          auVar167 = auVar114 & auVar124;
          if ((((((((auVar167 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar167 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar167 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar167 >> 0x7f,0) != '\0') ||
                (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar167 >> 0xbf,0) != '\0') ||
              (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar167[0x1f] < '\0') {
            local_3a0 = vandps_avx(auVar124,auVar114);
            auVar133._8_4_ = 0xbf800000;
            auVar133._0_8_ = 0xbf800000bf800000;
            auVar133._12_4_ = 0xbf800000;
            auVar133._16_4_ = 0xbf800000;
            auVar133._20_4_ = 0xbf800000;
            auVar133._24_4_ = 0xbf800000;
            auVar133._28_4_ = 0xbf800000;
            auVar145._8_4_ = 0x40000000;
            auVar145._0_8_ = 0x4000000040000000;
            auVar145._12_4_ = 0x40000000;
            auVar145._16_4_ = 0x40000000;
            auVar145._20_4_ = 0x40000000;
            auVar145._24_4_ = 0x40000000;
            auVar145._28_4_ = 0x40000000;
            auVar10 = vfmadd213ps_fma(local_4c0,auVar145,auVar133);
            local_460 = local_120;
            local_440 = ZEXT1632(auVar10);
            local_420 = local_2a0;
            local_400 = 0;
            local_4c0 = local_440;
            if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              auVar135 = ZEXT3264(CONCAT428(fVar223,CONCAT424(fVar219,CONCAT420(fVar223,CONCAT416(
                                                  fVar219,CONCAT412(fVar223,CONCAT48(fVar219,uVar110
                                                                                    )))))));
              auVar196 = ZEXT3264(CONCAT428(local_740,
                                            CONCAT424(local_740,
                                                      CONCAT420(local_740,
                                                                CONCAT416(local_740,
                                                                          CONCAT412(local_740,
                                                                                    CONCAT48(
                                                  local_740,CONCAT44(local_740,local_740))))))));
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar107 = true, pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar137 = 1.0 / auVar118._0_4_;
                local_380[0] = fVar137 * (local_120._0_4_ + 0.0);
                local_380[1] = fVar137 * (local_120._4_4_ + 1.0);
                local_380[2] = fVar137 * (local_120._8_4_ + 2.0);
                local_380[3] = fVar137 * (local_120._12_4_ + 3.0);
                fStack_370 = fVar137 * (local_120._16_4_ + 4.0);
                fStack_36c = fVar137 * (local_120._20_4_ + 5.0);
                fStack_368 = fVar137 * (local_120._24_4_ + 6.0);
                fStack_364 = local_120._28_4_ + 7.0;
                local_4c0._0_8_ = auVar10._0_8_;
                local_4c0._8_8_ = auVar10._8_8_;
                local_360 = local_4c0._0_8_;
                uStack_358 = local_4c0._8_8_;
                uStack_350 = 0;
                uStack_348 = 0;
                local_340 = local_2a0._0_8_;
                uStack_338 = local_2a0._8_8_;
                uStack_330 = local_2a0._16_8_;
                uStack_328 = local_2a0._24_8_;
                uVar101 = vmovmskps_avx(local_3a0);
                bVar107 = uVar101 != 0;
                if (uVar101 == 0) {
                  auVar135 = ZEXT3264(CONCAT428(fVar223,CONCAT424(fVar219,CONCAT420(fVar223,
                                                  CONCAT416(fVar219,CONCAT412(fVar223,CONCAT48(
                                                  fVar219,uVar110)))))));
                }
                else {
                  uVar102 = 0;
                  uVar103 = (ulong)(uVar101 & 0xff);
                  for (uVar104 = uVar103; (uVar104 & 1) == 0;
                      uVar104 = uVar104 >> 1 | 0x8000000000000000) {
                    uVar102 = uVar102 + 1;
                  }
                  local_640._4_4_ = uVar99;
                  local_640._0_4_ = uVar99;
                  local_640._8_4_ = uVar99;
                  local_640._12_4_ = uVar99;
                  local_640._16_4_ = uVar99;
                  local_640._20_4_ = uVar99;
                  local_640._24_4_ = uVar99;
                  local_640._28_4_ = uVar99;
                  local_6e0._0_4_ = local_6e0._4_4_;
                  local_6e0._8_4_ = local_6e0._4_4_;
                  local_6e0._12_4_ = local_6e0._4_4_;
                  local_6e0._16_4_ = local_6e0._4_4_;
                  local_6e0._20_4_ = local_6e0._4_4_;
                  local_6e0._24_4_ = local_6e0._4_4_;
                  local_6e0._28_4_ = local_6e0._4_4_;
                  _auStack_6f0 = auVar125._16_16_;
                  _local_700 = *pauVar2;
                  _local_660 = ZEXT1632(*pauVar3);
                  _auStack_570 = auVar24._16_16_;
                  _local_580 = *pauVar4;
                  local_680 = auVar208;
                  local_3fc = iVar100;
                  local_3f0 = uVar174;
                  uStack_3e8 = uVar91;
                  local_3e0 = local_690;
                  uStack_3d8 = uStack_688;
                  local_3d0 = local_6a0;
                  uStack_3c8 = uStack_698;
                  local_3c0 = local_6b0;
                  uStack_3b8 = uStack_6a8;
                  do {
                    uVar206 = *(undefined4 *)(ray + k * 4 + 0x100);
                    fVar137 = local_380[uVar102];
                    auVar112._4_4_ = fVar137;
                    auVar112._0_4_ = fVar137;
                    auVar112._8_4_ = fVar137;
                    auVar112._12_4_ = fVar137;
                    local_220._16_4_ = fVar137;
                    local_220._0_16_ = auVar112;
                    local_220._20_4_ = fVar137;
                    local_220._24_4_ = fVar137;
                    local_220._28_4_ = fVar137;
                    uVar7 = *(undefined4 *)((long)&local_360 + uVar102 * 4);
                    local_200._4_4_ = uVar7;
                    local_200._0_4_ = uVar7;
                    local_200._8_4_ = uVar7;
                    local_200._12_4_ = uVar7;
                    local_200._16_4_ = uVar7;
                    local_200._20_4_ = uVar7;
                    local_200._24_4_ = uVar7;
                    local_200._28_4_ = uVar7;
                    *(undefined4 *)(ray + k * 4 + 0x100) =
                         *(undefined4 *)((long)&local_340 + uVar102 * 4);
                    fVar168 = 1.0 - fVar137;
                    auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar112,
                                              ZEXT416(0xc0a00000));
                    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar137 * fVar137 * 3.0)),
                                              ZEXT416((uint)(fVar137 + fVar137)),auVar10);
                    auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar112,
                                              ZEXT416(0x40000000));
                    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar168 * fVar168 * -3.0)),
                                              ZEXT416((uint)(fVar168 + fVar168)),auVar10);
                    auVar14 = vfnmadd231ss_fma(ZEXT416((uint)(fVar137 * (fVar168 + fVar168))),
                                               ZEXT416((uint)fVar168),ZEXT416((uint)fVar168));
                    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar137 * fVar137)),auVar112,
                                              ZEXT416((uint)(fVar168 * -2.0)));
                    fVar137 = auVar10._0_4_ * 0.5;
                    fVar168 = auVar13._0_4_ * 0.5;
                    auVar154._0_4_ = fVar168 * (float)local_580._0_4_;
                    auVar154._4_4_ = fVar168 * (float)local_580._4_4_;
                    auVar154._8_4_ = fVar168 * fStack_578;
                    auVar154._12_4_ = fVar168 * fStack_574;
                    auVar139._4_4_ = fVar137;
                    auVar139._0_4_ = fVar137;
                    auVar139._8_4_ = fVar137;
                    auVar139._12_4_ = fVar137;
                    auVar10 = vfmadd132ps_fma(auVar139,auVar154,_local_660);
                    fVar137 = auVar11._0_4_ * 0.5;
                    auVar155._4_4_ = fVar137;
                    auVar155._0_4_ = fVar137;
                    auVar155._8_4_ = fVar137;
                    auVar155._12_4_ = fVar137;
                    auVar10 = vfmadd132ps_fma(auVar155,auVar10,_local_700);
                    local_770.context = context->user;
                    fVar137 = auVar14._0_4_ * 0.5;
                    auVar140._4_4_ = fVar137;
                    auVar140._0_4_ = fVar137;
                    auVar140._8_4_ = fVar137;
                    auVar140._12_4_ = fVar137;
                    auVar11 = vfmadd132ps_fma(auVar140,auVar10,auVar20);
                    local_280 = auVar11._0_4_;
                    uStack_27c = local_280;
                    uStack_278 = local_280;
                    uStack_274 = local_280;
                    uStack_270 = local_280;
                    uStack_26c = local_280;
                    uStack_268 = local_280;
                    uStack_264 = local_280;
                    auVar10 = vmovshdup_avx(auVar11);
                    local_260 = auVar10._0_8_;
                    uStack_258 = local_260;
                    uStack_250 = local_260;
                    uStack_248 = local_260;
                    auVar10 = vshufps_avx(auVar11,auVar11,0xaa);
                    local_240 = auVar10._0_8_;
                    uStack_238 = local_240;
                    uStack_230 = local_240;
                    uStack_228 = local_240;
                    local_1e0 = local_6e0._0_8_;
                    uStack_1d8 = local_6e0._8_8_;
                    uStack_1d0 = local_6e0._16_8_;
                    uStack_1c8 = local_6e0._24_8_;
                    local_1c0 = local_640;
                    auVar114 = vpcmpeqd_avx2(local_200,local_200);
                    local_1a0 = (local_770.context)->instID[0];
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_180 = (local_770.context)->instPrimID[0];
                    uStack_17c = local_180;
                    uStack_178 = local_180;
                    uStack_174 = local_180;
                    uStack_170 = local_180;
                    uStack_16c = local_180;
                    uStack_168 = local_180;
                    uStack_164 = local_180;
                    local_5e0 = local_2e0._0_8_;
                    uStack_5d8 = local_2e0._8_8_;
                    uStack_5d0 = local_2e0._16_8_;
                    uStack_5c8 = local_2e0._24_8_;
                    local_770.valid = (int *)&local_5e0;
                    local_770.geometryUserPtr = pGVar18->userPtr;
                    local_770.hit = (RTCHitN *)&local_280;
                    local_770.N = 8;
                    local_770.ray = (RTCRayN *)ray;
                    if (pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar18->occlusionFilterN)(&local_770);
                      auVar136._8_56_ = extraout_var;
                      auVar136._0_8_ = extraout_XMM1_Qa;
                      auVar212 = ZEXT3264(_local_720);
                      auVar152 = ZEXT3264(local_680);
                      auVar196 = ZEXT3264(CONCAT428(fStack_724,
                                                    CONCAT424(fStack_728,
                                                              CONCAT420(fStack_72c,
                                                                        CONCAT416(fStack_730,
                                                                                  CONCAT412(
                                                  fStack_734,
                                                  CONCAT48(fStack_738,CONCAT44(fStack_73c,local_740)
                                                          )))))));
                      auVar114 = vpcmpeqd_avx2(auVar136._0_32_,auVar136._0_32_);
                    }
                    auVar93._8_8_ = uStack_5d8;
                    auVar93._0_8_ = local_5e0;
                    auVar93._16_8_ = uStack_5d0;
                    auVar93._24_8_ = uStack_5c8;
                    auVar167 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar93);
                    auVar124 = auVar114 & ~auVar167;
                    if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar124 >> 0x7f,0) == '\0') &&
                          (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar124 >> 0xbf,0) == '\0') &&
                        (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar124[0x1f]) {
                      auVar167 = auVar167 ^ auVar114;
                    }
                    else {
                      p_Var19 = context->args->filter;
                      if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var19)(&local_770);
                        auVar212 = ZEXT3264(_local_720);
                        auVar152 = ZEXT3264(local_680);
                        auVar196 = ZEXT3264(CONCAT428(fStack_724,
                                                      CONCAT424(fStack_728,
                                                                CONCAT420(fStack_72c,
                                                                          CONCAT416(fStack_730,
                                                                                    CONCAT412(
                                                  fStack_734,
                                                  CONCAT48(fStack_738,CONCAT44(fStack_73c,local_740)
                                                          )))))));
                      }
                      auVar94._8_8_ = uStack_5d8;
                      auVar94._0_8_ = local_5e0;
                      auVar94._16_8_ = uStack_5d0;
                      auVar94._24_8_ = uStack_5c8;
                      auVar124 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                      auVar114 = vpcmpeqd_avx2(auVar124,auVar94);
                      auVar167 = vpcmpeqd_avx2(auVar124,auVar124);
                      auVar167 = auVar114 ^ auVar167;
                      auVar146._8_4_ = 0xff800000;
                      auVar146._0_8_ = 0xff800000ff800000;
                      auVar146._12_4_ = 0xff800000;
                      auVar146._16_4_ = 0xff800000;
                      auVar146._20_4_ = 0xff800000;
                      auVar146._24_4_ = 0xff800000;
                      auVar146._28_4_ = 0xff800000;
                      auVar114 = vblendvps_avx(auVar146,*(undefined1 (*) [32])
                                                         (local_770.ray + 0x100),auVar114);
                      *(undefined1 (*) [32])(local_770.ray + 0x100) = auVar114;
                    }
                    auVar208 = auVar152._0_32_;
                    auVar135 = ZEXT3264(CONCAT428(fVar223,CONCAT424(fVar219,CONCAT420(fVar223,
                                                  CONCAT416(fVar219,CONCAT412(fVar223,CONCAT48(
                                                  fVar219,uVar110)))))));
                    if ((((((((auVar167 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar167 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar167 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar167 >> 0x7f,0) != '\0') ||
                          (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar167 >> 0xbf,0) != '\0') ||
                        (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar167[0x1f] < '\0') break;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar206;
                    uVar104 = uVar102 & 0x3f;
                    uVar102 = 0;
                    uVar103 = uVar103 ^ 1L << uVar104;
                    for (uVar104 = uVar103; (uVar104 & 1) == 0;
                        uVar104 = uVar104 >> 1 | 0x8000000000000000) {
                      uVar102 = uVar102 + 1;
                    }
                    bVar107 = uVar103 != 0;
                  } while (bVar107);
                }
                local_6e0._4_4_ = (uint)local_540;
              }
              goto LAB_018ae64b;
            }
          }
        }
        bVar107 = false;
        auVar135 = ZEXT3264(CONCAT428(fVar223,CONCAT424(fVar219,CONCAT420(fVar223,CONCAT416(fVar219,
                                                  CONCAT412(fVar223,CONCAT48(fVar219,uVar110)))))));
        auVar196 = ZEXT3264(CONCAT428(local_740,
                                      CONCAT424(local_740,
                                                CONCAT420(local_740,
                                                          CONCAT416(local_740,
                                                                    CONCAT412(local_740,
                                                                              CONCAT48(local_740,
                                                                                       CONCAT44(
                                                  local_740,local_740))))))));
      }
LAB_018ae64b:
      local_540._0_4_ = local_6e0._4_4_;
      auVar152 = ZEXT3264(local_600);
      if (8 < iVar100) {
        local_660._4_4_ = iVar100;
        local_660._0_4_ = iVar100;
        fStack_658 = (float)iVar100;
        fStack_654 = (float)iVar100;
        fStack_650 = (float)iVar100;
        fStack_64c = (float)iVar100;
        fStack_648 = (float)iVar100;
        iStack_644 = iVar100;
        local_580._4_4_ = fVar138;
        local_580._0_4_ = fVar138;
        fStack_578 = fVar138;
        fStack_574 = fVar138;
        auStack_570._0_4_ = fVar138;
        auStack_570._4_4_ = fVar138;
        fStack_568 = fVar138;
        fStack_564 = fVar138;
        local_4a0._4_4_ = uVar109;
        local_4a0._0_4_ = uVar109;
        local_4a0._8_4_ = uVar109;
        local_4a0._12_4_ = uVar109;
        local_4a0._16_4_ = uVar109;
        local_4a0._20_4_ = uVar109;
        local_4a0._24_4_ = uVar109;
        local_4a0._28_4_ = uVar109;
        local_160 = 1.0 / (float)local_520._0_4_;
        fStack_15c = local_160;
        fStack_158 = local_160;
        fStack_154 = local_160;
        fStack_150 = local_160;
        fStack_14c = local_160;
        fStack_148 = local_160;
        fStack_144 = local_160;
        local_140 = uVar99;
        uStack_13c = uVar99;
        uStack_138 = uVar99;
        uStack_134 = uVar99;
        uStack_130 = uVar99;
        uStack_12c = uVar99;
        uStack_128 = uVar99;
        uStack_124 = uVar99;
        local_540 = CONCAT44((uint)local_540,(uint)local_540);
        uStack_538 = (uint)local_540;
        uStack_534 = (uint)local_540;
        uStack_530 = (uint)local_540;
        uStack_52c = (uint)local_540;
        uStack_528 = (uint)local_540;
        uStack_524 = (uint)local_540;
        lVar105 = 8;
        _local_720 = auVar212._0_32_;
        local_680 = auVar208;
        do {
          auVar114 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar105 * 4 + lVar25);
          auVar124 = *(undefined1 (*) [32])(lVar25 + 0x22307f0 + lVar105 * 4);
          auVar167 = *(undefined1 (*) [32])(lVar25 + 0x2230c74 + lVar105 * 4);
          pauVar5 = (undefined1 (*) [32])(lVar25 + 0x22310f8 + lVar105 * 4);
          auVar97 = *(undefined1 (*) [28])*pauVar5;
          fVar192 = auVar196._0_4_;
          auVar213._0_4_ = fVar192 * *(float *)*pauVar5;
          fVar198 = auVar196._4_4_;
          auVar213._4_4_ = fVar198 * *(float *)(*pauVar5 + 4);
          fVar199 = auVar196._8_4_;
          auVar213._8_4_ = fVar199 * *(float *)(*pauVar5 + 8);
          fVar200 = auVar196._12_4_;
          auVar213._12_4_ = fVar200 * *(float *)(*pauVar5 + 0xc);
          fVar201 = auVar196._16_4_;
          auVar213._16_4_ = fVar201 * *(float *)(*pauVar5 + 0x10);
          fVar202 = auVar196._20_4_;
          auVar213._20_4_ = fVar202 * *(float *)(*pauVar5 + 0x14);
          fVar203 = auVar196._24_4_;
          auVar213._28_36_ = auVar212._28_36_;
          auVar213._24_4_ = fVar203 * *(float *)(*pauVar5 + 0x18);
          auVar56._4_4_ = auVar135._4_4_ * *(float *)(*pauVar5 + 4);
          auVar56._0_4_ = auVar135._0_4_ * *(float *)*pauVar5;
          auVar56._8_4_ = auVar135._8_4_ * *(float *)(*pauVar5 + 8);
          auVar56._12_4_ = auVar135._12_4_ * *(float *)(*pauVar5 + 0xc);
          auVar56._16_4_ = auVar135._16_4_ * *(float *)(*pauVar5 + 0x10);
          auVar56._20_4_ = auVar135._20_4_ * *(float *)(*pauVar5 + 0x14);
          auVar56._24_4_ = auVar135._24_4_ * *(float *)(*pauVar5 + 0x18);
          auVar56._28_4_ = *(undefined4 *)(*pauVar5 + 0x1c);
          auVar20 = vfmadd231ps_fma(auVar213._0_32_,auVar167,auVar152._0_32_);
          auVar10 = vfmadd231ps_fma(auVar56,auVar167,auVar161);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar124,auVar216);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar124,local_500);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar114,auVar158);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar114,local_560);
          auVar122 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar105 * 4 + lVar25);
          auVar132 = *(undefined1 (*) [32])(lVar25 + 0x2232c10 + lVar105 * 4);
          auVar23 = *(undefined1 (*) [32])(lVar25 + 0x2233094 + lVar105 * 4);
          pfVar6 = (float *)(lVar25 + 0x2233518 + lVar105 * 4);
          fVar173 = *pfVar6;
          fVar209 = pfVar6[1];
          fVar214 = pfVar6[2];
          fVar87 = pfVar6[3];
          fVar88 = pfVar6[4];
          fVar89 = pfVar6[5];
          fVar90 = pfVar6[6];
          auVar57._4_4_ = fVar198 * fVar209;
          auVar57._0_4_ = fVar192 * fVar173;
          auVar57._8_4_ = fVar199 * fVar214;
          auVar57._12_4_ = fVar200 * fVar87;
          auVar57._16_4_ = fVar201 * fVar88;
          auVar57._20_4_ = fVar202 * fVar89;
          auVar57._24_4_ = fVar203 * fVar90;
          auVar57._28_4_ = auVar124._28_4_;
          auVar58._4_4_ = fVar209 * auVar135._4_4_;
          auVar58._0_4_ = fVar173 * auVar135._0_4_;
          auVar58._8_4_ = fVar214 * auVar135._8_4_;
          auVar58._12_4_ = fVar87 * auVar135._12_4_;
          auVar58._16_4_ = fVar88 * auVar135._16_4_;
          auVar58._20_4_ = fVar89 * auVar135._20_4_;
          auVar58._24_4_ = fVar90 * auVar135._24_4_;
          auVar58._28_4_ = auVar114._28_4_;
          auVar11 = vfmadd231ps_fma(auVar57,auVar23,auVar152._0_32_);
          auVar13 = vfmadd231ps_fma(auVar58,auVar23,auVar161);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar132,auVar216);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar132,local_500);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar122,auVar158);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar122,local_560);
          auVar179 = ZEXT1632(auVar11);
          auVar184 = ZEXT1632(auVar20);
          auVar24 = vsubps_avx(auVar179,auVar184);
          auVar127 = ZEXT1632(auVar13);
          auVar143 = ZEXT1632(auVar10);
          auVar125 = vsubps_avx(auVar127,auVar143);
          auVar86._4_4_ = auVar24._4_4_ * auVar10._4_4_;
          auVar86._0_4_ = auVar24._0_4_ * auVar10._0_4_;
          auVar86._8_4_ = auVar24._8_4_ * auVar10._8_4_;
          auVar86._12_4_ = auVar24._12_4_ * auVar10._12_4_;
          auVar86._16_4_ = auVar24._16_4_ * 0.0;
          auVar86._20_4_ = auVar24._20_4_ * 0.0;
          auVar86._24_4_ = auVar24._24_4_ * 0.0;
          auVar86._28_4_ = local_500._28_4_;
          fVar138 = auVar125._0_4_;
          auVar152._0_4_ = auVar20._0_4_ * fVar138;
          fVar137 = auVar125._4_4_;
          auVar152._4_4_ = auVar20._4_4_ * fVar137;
          fVar168 = auVar125._8_4_;
          auVar152._8_4_ = auVar20._8_4_ * fVar168;
          fVar169 = auVar125._12_4_;
          auVar152._12_4_ = auVar20._12_4_ * fVar169;
          fVar170 = auVar125._16_4_;
          auVar152._16_4_ = fVar170 * 0.0;
          fVar171 = auVar125._20_4_;
          auVar152._20_4_ = fVar171 * 0.0;
          fVar172 = auVar125._24_4_;
          auVar152._28_36_ = auVar135._28_36_;
          auVar152._24_4_ = fVar172 * 0.0;
          auVar212 = ZEXT3264(*pauVar5);
          auVar22 = vsubps_avx(auVar86,auVar152._0_32_);
          auVar183._0_4_ = auVar97._0_4_ * (float)local_100;
          auVar183._4_4_ = auVar97._4_4_ * local_100._4_4_;
          auVar183._8_4_ = auVar97._8_4_ * (float)uStack_f8;
          auVar183._12_4_ = auVar97._12_4_ * uStack_f8._4_4_;
          auVar183._16_4_ = auVar97._16_4_ * (float)uStack_f0;
          auVar183._20_4_ = auVar97._20_4_ * uStack_f0._4_4_;
          auVar183._24_4_ = auVar97._24_4_ * (float)uStack_e8;
          auVar183._28_4_ = 0;
          auVar20 = vfmadd231ps_fma(auVar183,auVar167,local_e0);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_c0,auVar124);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_a0,auVar114);
          auVar59._4_4_ = fVar209 * local_100._4_4_;
          auVar59._0_4_ = fVar173 * (float)local_100;
          auVar59._8_4_ = fVar214 * (float)uStack_f8;
          auVar59._12_4_ = fVar87 * uStack_f8._4_4_;
          auVar59._16_4_ = fVar88 * (float)uStack_f0;
          auVar59._20_4_ = fVar89 * uStack_f0._4_4_;
          auVar59._24_4_ = fVar90 * (float)uStack_e8;
          auVar59._28_4_ = uStack_e8._4_4_;
          auVar10 = vfmadd231ps_fma(auVar59,auVar23,local_e0);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar132,local_c0);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar122,local_a0);
          auVar197._0_4_ = fVar138 * fVar138;
          auVar197._4_4_ = fVar137 * fVar137;
          auVar197._8_4_ = fVar168 * fVar168;
          auVar197._12_4_ = fVar169 * fVar169;
          auVar197._16_4_ = fVar170 * fVar170;
          auVar197._20_4_ = fVar171 * fVar171;
          auVar197._28_36_ = auVar196._28_36_;
          auVar197._24_4_ = fVar172 * fVar172;
          auVar11 = vfmadd231ps_fma(auVar197._0_32_,auVar24,auVar24);
          auVar163 = vmaxps_avx(ZEXT1632(auVar20),ZEXT1632(auVar10));
          auVar194._0_4_ = auVar163._0_4_ * auVar163._0_4_ * auVar11._0_4_;
          auVar194._4_4_ = auVar163._4_4_ * auVar163._4_4_ * auVar11._4_4_;
          auVar194._8_4_ = auVar163._8_4_ * auVar163._8_4_ * auVar11._8_4_;
          auVar194._12_4_ = auVar163._12_4_ * auVar163._12_4_ * auVar11._12_4_;
          auVar194._16_4_ = auVar163._16_4_ * auVar163._16_4_ * 0.0;
          auVar194._20_4_ = auVar163._20_4_ * auVar163._20_4_ * 0.0;
          auVar194._24_4_ = auVar163._24_4_ * auVar163._24_4_ * 0.0;
          auVar194._28_4_ = 0;
          auVar60._4_4_ = auVar22._4_4_ * auVar22._4_4_;
          auVar60._0_4_ = auVar22._0_4_ * auVar22._0_4_;
          auVar60._8_4_ = auVar22._8_4_ * auVar22._8_4_;
          auVar60._12_4_ = auVar22._12_4_ * auVar22._12_4_;
          auVar60._16_4_ = auVar22._16_4_ * auVar22._16_4_;
          auVar60._20_4_ = auVar22._20_4_ * auVar22._20_4_;
          auVar60._24_4_ = auVar22._24_4_ * auVar22._24_4_;
          auVar60._28_4_ = auVar22._28_4_;
          auVar163 = vcmpps_avx(auVar60,auVar194,2);
          local_400 = (int)lVar105;
          auVar195._4_4_ = local_400;
          auVar195._0_4_ = local_400;
          auVar195._8_4_ = local_400;
          auVar195._12_4_ = local_400;
          auVar195._16_4_ = local_400;
          auVar195._20_4_ = local_400;
          auVar195._24_4_ = local_400;
          auVar195._28_4_ = local_400;
          auVar22 = vpor_avx2(auVar195,_DAT_0205a920);
          auVar116 = vpcmpgtd_avx2(_local_660,auVar22);
          auVar22 = auVar116 & auVar163;
          if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar22 >> 0x7f,0) == '\0') &&
                (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar22 >> 0xbf,0) == '\0') &&
              (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar22[0x1f]) {
            auVar152 = ZEXT3264(local_600);
            auVar196 = ZEXT3264(auVar196._0_32_);
            auVar135 = ZEXT3264(CONCAT428(fVar223,CONCAT424(fVar219,CONCAT420(fVar223,CONCAT416(
                                                  fVar219,CONCAT412(fVar223,CONCAT48(fVar219,uVar110
                                                                                    )))))));
          }
          else {
            local_520 = vandps_avx(auVar116,auVar163);
            auVar61._4_4_ = (float)local_720._4_4_ * fVar209;
            auVar61._0_4_ = (float)local_720._0_4_ * fVar173;
            auVar61._8_4_ = fStack_718 * fVar214;
            auVar61._12_4_ = fStack_714 * fVar87;
            auVar61._16_4_ = fStack_710 * fVar88;
            auVar61._20_4_ = fStack_70c * fVar89;
            auVar61._24_4_ = fStack_708 * fVar90;
            auVar61._28_4_ = auVar163._28_4_;
            auVar11 = vfmadd213ps_fma(auVar23,local_680,auVar61);
            auVar11 = vfmadd213ps_fma(auVar132,auVar222,ZEXT1632(auVar11));
            auVar11 = vfmadd132ps_fma(auVar122,ZEXT1632(auVar11),local_620);
            auVar62._4_4_ = (float)local_720._4_4_ * auVar97._4_4_;
            auVar62._0_4_ = (float)local_720._0_4_ * auVar97._0_4_;
            auVar62._8_4_ = fStack_718 * auVar97._8_4_;
            auVar62._12_4_ = fStack_714 * auVar97._12_4_;
            auVar62._16_4_ = fStack_710 * auVar97._16_4_;
            auVar62._20_4_ = fStack_70c * auVar97._20_4_;
            auVar62._24_4_ = fStack_708 * auVar97._24_4_;
            auVar62._28_4_ = auVar163._28_4_;
            auVar13 = vfmadd213ps_fma(auVar167,local_680,auVar62);
            auVar13 = vfmadd213ps_fma(auVar124,auVar222,ZEXT1632(auVar13));
            auVar124 = *(undefined1 (*) [32])(lVar25 + 0x223157c + lVar105 * 4);
            auVar167 = *(undefined1 (*) [32])(lVar25 + 0x2231a00 + lVar105 * 4);
            auVar122 = *(undefined1 (*) [32])(lVar25 + 0x2231e84 + lVar105 * 4);
            pfVar6 = (float *)(lVar25 + 0x2232308 + lVar105 * 4);
            fVar138 = *pfVar6;
            fVar137 = pfVar6[1];
            fVar168 = pfVar6[2];
            fVar169 = pfVar6[3];
            fVar170 = pfVar6[4];
            fVar171 = pfVar6[5];
            fVar172 = pfVar6[6];
            auVar63._4_4_ = fVar137 * fVar198;
            auVar63._0_4_ = fVar138 * fVar192;
            auVar63._8_4_ = fVar168 * fVar199;
            auVar63._12_4_ = fVar169 * fVar200;
            auVar63._16_4_ = fVar170 * fVar201;
            auVar63._20_4_ = fVar171 * fVar202;
            auVar63._24_4_ = fVar172 * fVar203;
            auVar63._28_4_ = auVar12._4_4_;
            auVar64._4_4_ = fVar137 * fVar223;
            auVar64._0_4_ = fVar138 * fVar219;
            auVar64._8_4_ = fVar168 * fVar219;
            auVar64._12_4_ = fVar169 * fVar223;
            auVar64._16_4_ = fVar170 * fVar219;
            auVar64._20_4_ = fVar171 * fVar223;
            auVar64._24_4_ = fVar172 * fVar219;
            auVar64._28_4_ = *(undefined4 *)(*pauVar5 + 0x1c);
            auVar65._4_4_ = (float)local_720._4_4_ * fVar137;
            auVar65._0_4_ = (float)local_720._0_4_ * fVar138;
            auVar65._8_4_ = fStack_718 * fVar168;
            auVar65._12_4_ = fStack_714 * fVar169;
            auVar65._16_4_ = fStack_710 * fVar170;
            auVar65._20_4_ = fStack_70c * fVar171;
            auVar65._24_4_ = fStack_708 * fVar172;
            auVar65._28_4_ = pfVar6[7];
            auVar14 = vfmadd231ps_fma(auVar63,auVar122,local_600);
            auVar15 = vfmadd231ps_fma(auVar64,auVar122,auVar161);
            auVar16 = vfmadd231ps_fma(auVar65,local_680,auVar122);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar167,auVar216);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar167,local_500);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar167,auVar222);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar124,auVar158);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar124,local_560);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar124,local_620);
            pfVar6 = (float *)(lVar25 + 0x2234728 + lVar105 * 4);
            fVar138 = *pfVar6;
            fVar137 = pfVar6[1];
            fVar168 = pfVar6[2];
            fVar169 = pfVar6[3];
            fVar170 = pfVar6[4];
            fVar171 = pfVar6[5];
            fVar172 = pfVar6[6];
            auVar66._4_4_ = fVar198 * fVar137;
            auVar66._0_4_ = fVar192 * fVar138;
            auVar66._8_4_ = fVar199 * fVar168;
            auVar66._12_4_ = fVar200 * fVar169;
            auVar66._16_4_ = fVar201 * fVar170;
            auVar66._20_4_ = fVar202 * fVar171;
            auVar66._24_4_ = fVar203 * fVar172;
            auVar66._28_4_ = auVar24._28_4_;
            auVar67._4_4_ = fVar223 * fVar137;
            auVar67._0_4_ = fVar219 * fVar138;
            auVar67._8_4_ = fVar219 * fVar168;
            auVar67._12_4_ = fVar223 * fVar169;
            auVar67._16_4_ = fVar219 * fVar170;
            auVar67._20_4_ = fVar223 * fVar171;
            auVar67._24_4_ = fVar219 * fVar172;
            auVar67._28_4_ = auVar125._28_4_;
            auVar68._4_4_ = fVar137 * (float)local_720._4_4_;
            auVar68._0_4_ = fVar138 * (float)local_720._0_4_;
            auVar68._8_4_ = fVar168 * fStack_718;
            auVar68._12_4_ = fVar169 * fStack_714;
            auVar68._16_4_ = fVar170 * fStack_710;
            auVar68._20_4_ = fVar171 * fStack_70c;
            auVar68._24_4_ = fVar172 * fStack_708;
            auVar68._28_4_ = pfVar6[7];
            auVar124 = *(undefined1 (*) [32])(lVar25 + 0x22342a4 + lVar105 * 4);
            auVar111 = vfmadd231ps_fma(auVar66,auVar124,local_600);
            auVar175 = vfmadd231ps_fma(auVar67,auVar124,auVar161);
            auVar27 = vfmadd231ps_fma(auVar68,auVar124,local_680);
            auVar124 = *(undefined1 (*) [32])(lVar25 + 0x2233e20 + lVar105 * 4);
            auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar124,auVar216);
            auVar175 = vfmadd231ps_fma(ZEXT1632(auVar175),auVar124,local_500);
            auVar27 = vfmadd231ps_fma(ZEXT1632(auVar27),auVar124,auVar222);
            auVar124 = *(undefined1 (*) [32])(lVar25 + 0x223399c + lVar105 * 4);
            auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar124,auVar158);
            auVar175 = vfmadd231ps_fma(ZEXT1632(auVar175),auVar124,local_560);
            auVar27 = vfmadd231ps_fma(ZEXT1632(auVar27),local_620,auVar124);
            auVar124 = vandps_avx(ZEXT1632(auVar14),local_2c0);
            auVar167 = vandps_avx(ZEXT1632(auVar15),local_2c0);
            auVar167 = vmaxps_avx(auVar124,auVar167);
            auVar124 = vandps_avx(ZEXT1632(auVar16),local_2c0);
            auVar124 = vmaxps_avx(auVar167,auVar124);
            auVar124 = vcmpps_avx(auVar124,_local_580,1);
            auVar122 = vblendvps_avx(ZEXT1632(auVar14),auVar24,auVar124);
            auVar132 = vblendvps_avx(ZEXT1632(auVar15),auVar125,auVar124);
            auVar124 = vandps_avx(ZEXT1632(auVar111),local_2c0);
            auVar167 = vandps_avx(ZEXT1632(auVar175),local_2c0);
            auVar167 = vmaxps_avx(auVar124,auVar167);
            auVar124 = vandps_avx(local_2c0,ZEXT1632(auVar27));
            auVar124 = vmaxps_avx(auVar167,auVar124);
            auVar167 = vcmpps_avx(auVar124,_local_580,1);
            auVar124 = vblendvps_avx(ZEXT1632(auVar111),auVar24,auVar167);
            auVar167 = vblendvps_avx(ZEXT1632(auVar175),auVar125,auVar167);
            auVar13 = vfmadd213ps_fma(auVar114,local_620,ZEXT1632(auVar13));
            auVar14 = vfmadd213ps_fma(auVar122,auVar122,ZEXT832(0) << 0x20);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar132,auVar132);
            auVar114 = vrsqrtps_avx(ZEXT1632(auVar14));
            fVar138 = auVar114._0_4_;
            fVar137 = auVar114._4_4_;
            fVar168 = auVar114._8_4_;
            fVar169 = auVar114._12_4_;
            fVar170 = auVar114._16_4_;
            fVar171 = auVar114._20_4_;
            fVar172 = auVar114._24_4_;
            auVar69._4_4_ = fVar137 * fVar137 * fVar137 * auVar14._4_4_ * -0.5;
            auVar69._0_4_ = fVar138 * fVar138 * fVar138 * auVar14._0_4_ * -0.5;
            auVar69._8_4_ = fVar168 * fVar168 * fVar168 * auVar14._8_4_ * -0.5;
            auVar69._12_4_ = fVar169 * fVar169 * fVar169 * auVar14._12_4_ * -0.5;
            auVar69._16_4_ = fVar170 * fVar170 * fVar170 * -0.0;
            auVar69._20_4_ = fVar171 * fVar171 * fVar171 * -0.0;
            auVar69._24_4_ = fVar172 * fVar172 * fVar172 * -0.0;
            auVar69._28_4_ = 0;
            auVar160._8_4_ = 0x3fc00000;
            auVar160._0_8_ = 0x3fc000003fc00000;
            auVar160._12_4_ = 0x3fc00000;
            auVar160._16_4_ = 0x3fc00000;
            auVar160._20_4_ = 0x3fc00000;
            auVar160._24_4_ = 0x3fc00000;
            auVar160._28_4_ = 0x3fc00000;
            auVar14 = vfmadd231ps_fma(auVar69,auVar160,auVar114);
            fVar138 = auVar14._0_4_;
            fVar137 = auVar14._4_4_;
            auVar70._4_4_ = auVar132._4_4_ * fVar137;
            auVar70._0_4_ = auVar132._0_4_ * fVar138;
            fVar168 = auVar14._8_4_;
            auVar70._8_4_ = auVar132._8_4_ * fVar168;
            fVar169 = auVar14._12_4_;
            auVar70._12_4_ = auVar132._12_4_ * fVar169;
            auVar70._16_4_ = auVar132._16_4_ * 0.0;
            auVar70._20_4_ = auVar132._20_4_ * 0.0;
            auVar70._24_4_ = auVar132._24_4_ * 0.0;
            auVar70._28_4_ = auVar132._28_4_;
            auVar71._4_4_ = fVar137 * -auVar122._4_4_;
            auVar71._0_4_ = fVar138 * -auVar122._0_4_;
            auVar71._8_4_ = fVar168 * -auVar122._8_4_;
            auVar71._12_4_ = fVar169 * -auVar122._12_4_;
            auVar71._16_4_ = -auVar122._16_4_ * 0.0;
            auVar71._20_4_ = -auVar122._20_4_ * 0.0;
            auVar71._24_4_ = -auVar122._24_4_ * 0.0;
            auVar71._28_4_ = auVar114._28_4_;
            auVar14 = vfmadd213ps_fma(auVar124,auVar124,ZEXT832(0) << 0x20);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar167,auVar167);
            auVar114 = vrsqrtps_avx(ZEXT1632(auVar14));
            auVar72._28_4_ = fVar223;
            auVar72._0_28_ =
                 ZEXT1628(CONCAT412(fVar169 * 0.0,
                                    CONCAT48(fVar168 * 0.0,CONCAT44(fVar137 * 0.0,fVar138 * 0.0))));
            fVar138 = auVar114._0_4_;
            fVar137 = auVar114._4_4_;
            fVar168 = auVar114._8_4_;
            fVar169 = auVar114._12_4_;
            fVar170 = auVar114._16_4_;
            fVar171 = auVar114._20_4_;
            fVar172 = auVar114._24_4_;
            auVar73._4_4_ = fVar137 * fVar137 * fVar137 * auVar14._4_4_ * -0.5;
            auVar73._0_4_ = fVar138 * fVar138 * fVar138 * auVar14._0_4_ * -0.5;
            auVar73._8_4_ = fVar168 * fVar168 * fVar168 * auVar14._8_4_ * -0.5;
            auVar73._12_4_ = fVar169 * fVar169 * fVar169 * auVar14._12_4_ * -0.5;
            auVar73._16_4_ = fVar170 * fVar170 * fVar170 * -0.0;
            auVar73._20_4_ = fVar171 * fVar171 * fVar171 * -0.0;
            auVar73._24_4_ = fVar172 * fVar172 * fVar172 * -0.0;
            auVar73._28_4_ = 0;
            auVar14 = vfmadd231ps_fma(auVar73,auVar160,auVar114);
            fVar138 = auVar14._0_4_;
            fVar137 = auVar14._4_4_;
            auVar74._4_4_ = auVar167._4_4_ * fVar137;
            auVar74._0_4_ = auVar167._0_4_ * fVar138;
            fVar168 = auVar14._8_4_;
            auVar74._8_4_ = auVar167._8_4_ * fVar168;
            fVar169 = auVar14._12_4_;
            auVar74._12_4_ = auVar167._12_4_ * fVar169;
            auVar74._16_4_ = auVar167._16_4_ * 0.0;
            auVar74._20_4_ = auVar167._20_4_ * 0.0;
            auVar74._24_4_ = auVar167._24_4_ * 0.0;
            auVar74._28_4_ = 0;
            auVar75._4_4_ = fVar137 * -auVar124._4_4_;
            auVar75._0_4_ = fVar138 * -auVar124._0_4_;
            auVar75._8_4_ = fVar168 * -auVar124._8_4_;
            auVar75._12_4_ = fVar169 * -auVar124._12_4_;
            auVar75._16_4_ = -auVar124._16_4_ * 0.0;
            auVar75._20_4_ = -auVar124._20_4_ * 0.0;
            auVar75._24_4_ = -auVar124._24_4_ * 0.0;
            auVar75._28_4_ = 0;
            auVar76._28_4_ = 0xbf000000;
            auVar76._0_28_ =
                 ZEXT1628(CONCAT412(fVar169 * 0.0,
                                    CONCAT48(fVar168 * 0.0,CONCAT44(fVar137 * 0.0,fVar138 * 0.0))));
            auVar14 = vfmadd213ps_fma(auVar70,ZEXT1632(auVar20),auVar184);
            auVar114 = ZEXT1632(auVar20);
            auVar15 = vfmadd213ps_fma(auVar71,auVar114,auVar143);
            auVar16 = vfmadd213ps_fma(auVar72,auVar114,ZEXT1632(auVar13));
            auVar153 = vfnmadd213ps_fma(auVar70,auVar114,auVar184);
            auVar111 = vfmadd213ps_fma(auVar74,ZEXT1632(auVar10),auVar179);
            auVar176 = vfnmadd213ps_fma(auVar71,auVar114,auVar143);
            auVar114 = ZEXT1632(auVar10);
            auVar175 = vfmadd213ps_fma(auVar75,auVar114,auVar127);
            auVar184 = ZEXT1632(auVar20);
            auVar188 = vfnmadd231ps_fma(ZEXT1632(auVar13),auVar184,auVar72);
            auVar13 = vfmadd213ps_fma(auVar76,auVar114,ZEXT1632(auVar11));
            auVar177 = vfnmadd213ps_fma(auVar74,auVar114,auVar179);
            auVar187 = vfnmadd213ps_fma(auVar75,auVar114,auVar127);
            auVar204 = vfnmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar10),auVar76);
            auVar114 = vsubps_avx(ZEXT1632(auVar175),ZEXT1632(auVar176));
            auVar124 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar188));
            auVar185._0_4_ = auVar114._0_4_ * auVar188._0_4_;
            auVar185._4_4_ = auVar114._4_4_ * auVar188._4_4_;
            auVar185._8_4_ = auVar114._8_4_ * auVar188._8_4_;
            auVar185._12_4_ = auVar114._12_4_ * auVar188._12_4_;
            auVar185._16_4_ = auVar114._16_4_ * 0.0;
            auVar185._20_4_ = auVar114._20_4_ * 0.0;
            auVar185._24_4_ = auVar114._24_4_ * 0.0;
            auVar185._28_4_ = 0;
            auVar27 = vfmsub231ps_fma(auVar185,ZEXT1632(auVar176),auVar124);
            auVar77._4_4_ = auVar153._4_4_ * auVar124._4_4_;
            auVar77._0_4_ = auVar153._0_4_ * auVar124._0_4_;
            auVar77._8_4_ = auVar153._8_4_ * auVar124._8_4_;
            auVar77._12_4_ = auVar153._12_4_ * auVar124._12_4_;
            auVar77._16_4_ = auVar124._16_4_ * 0.0;
            auVar77._20_4_ = auVar124._20_4_ * 0.0;
            auVar77._24_4_ = auVar124._24_4_ * 0.0;
            auVar77._28_4_ = auVar124._28_4_;
            auVar163 = ZEXT1632(auVar153);
            auVar124 = vsubps_avx(ZEXT1632(auVar111),auVar163);
            auVar125 = ZEXT1632(auVar188);
            auVar11 = vfmsub231ps_fma(auVar77,auVar125,auVar124);
            auVar78._4_4_ = auVar176._4_4_ * auVar124._4_4_;
            auVar78._0_4_ = auVar176._0_4_ * auVar124._0_4_;
            auVar78._8_4_ = auVar176._8_4_ * auVar124._8_4_;
            auVar78._12_4_ = auVar176._12_4_ * auVar124._12_4_;
            auVar78._16_4_ = auVar124._16_4_ * 0.0;
            auVar78._20_4_ = auVar124._20_4_ * 0.0;
            auVar78._24_4_ = auVar124._24_4_ * 0.0;
            auVar78._28_4_ = auVar124._28_4_;
            auVar153 = vfmsub231ps_fma(auVar78,auVar163,auVar114);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar153),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar27));
            auVar22 = vcmpps_avx(ZEXT1632(auVar11),ZEXT832(0) << 0x20,2);
            auVar114 = vblendvps_avx(ZEXT1632(auVar177),ZEXT1632(auVar14),auVar22);
            auVar124 = vblendvps_avx(ZEXT1632(auVar187),ZEXT1632(auVar15),auVar22);
            auVar167 = vblendvps_avx(ZEXT1632(auVar204),ZEXT1632(auVar16),auVar22);
            auVar122 = vblendvps_avx(auVar163,ZEXT1632(auVar111),auVar22);
            auVar132 = vblendvps_avx(ZEXT1632(auVar176),ZEXT1632(auVar175),auVar22);
            auVar23 = vblendvps_avx(auVar125,ZEXT1632(auVar13),auVar22);
            auVar163 = vblendvps_avx(ZEXT1632(auVar111),auVar163,auVar22);
            auVar24 = vblendvps_avx(ZEXT1632(auVar175),ZEXT1632(auVar176),auVar22);
            auVar11 = vpackssdw_avx(local_520._0_16_,local_520._16_16_);
            auVar125 = vblendvps_avx(ZEXT1632(auVar13),auVar125,auVar22);
            auVar163 = vsubps_avx(auVar163,auVar114);
            auVar24 = vsubps_avx(auVar24,auVar124);
            auVar116 = vsubps_avx(auVar125,auVar167);
            auVar212 = ZEXT3264(auVar116);
            auVar127 = vsubps_avx(auVar114,auVar122);
            auVar143 = vsubps_avx(auVar124,auVar132);
            auVar179 = vsubps_avx(auVar167,auVar23);
            auVar164._0_4_ = auVar116._0_4_ * auVar114._0_4_;
            auVar164._4_4_ = auVar116._4_4_ * auVar114._4_4_;
            auVar164._8_4_ = auVar116._8_4_ * auVar114._8_4_;
            auVar164._12_4_ = auVar116._12_4_ * auVar114._12_4_;
            auVar164._16_4_ = auVar116._16_4_ * auVar114._16_4_;
            auVar164._20_4_ = auVar116._20_4_ * auVar114._20_4_;
            auVar164._24_4_ = auVar116._24_4_ * auVar114._24_4_;
            auVar164._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar164,auVar167,auVar163);
            auVar79._4_4_ = auVar163._4_4_ * auVar124._4_4_;
            auVar79._0_4_ = auVar163._0_4_ * auVar124._0_4_;
            auVar79._8_4_ = auVar163._8_4_ * auVar124._8_4_;
            auVar79._12_4_ = auVar163._12_4_ * auVar124._12_4_;
            auVar79._16_4_ = auVar163._16_4_ * auVar124._16_4_;
            auVar79._20_4_ = auVar163._20_4_ * auVar124._20_4_;
            auVar79._24_4_ = auVar163._24_4_ * auVar124._24_4_;
            auVar79._28_4_ = auVar125._28_4_;
            auVar14 = vfmsub231ps_fma(auVar79,auVar114,auVar24);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar13),_DAT_02020f00);
            auVar165._0_4_ = auVar24._0_4_ * auVar167._0_4_;
            auVar165._4_4_ = auVar24._4_4_ * auVar167._4_4_;
            auVar165._8_4_ = auVar24._8_4_ * auVar167._8_4_;
            auVar165._12_4_ = auVar24._12_4_ * auVar167._12_4_;
            auVar165._16_4_ = auVar24._16_4_ * auVar167._16_4_;
            auVar165._20_4_ = auVar24._20_4_ * auVar167._20_4_;
            auVar165._24_4_ = auVar24._24_4_ * auVar167._24_4_;
            auVar165._28_4_ = 0;
            auVar14 = vfmsub231ps_fma(auVar165,auVar124,auVar116);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
            auVar166._0_4_ = auVar179._0_4_ * auVar122._0_4_;
            auVar166._4_4_ = auVar179._4_4_ * auVar122._4_4_;
            auVar166._8_4_ = auVar179._8_4_ * auVar122._8_4_;
            auVar166._12_4_ = auVar179._12_4_ * auVar122._12_4_;
            auVar166._16_4_ = auVar179._16_4_ * auVar122._16_4_;
            auVar166._20_4_ = auVar179._20_4_ * auVar122._20_4_;
            auVar166._24_4_ = auVar179._24_4_ * auVar122._24_4_;
            auVar166._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar166,auVar127,auVar23);
            auVar80._4_4_ = auVar143._4_4_ * auVar23._4_4_;
            auVar80._0_4_ = auVar143._0_4_ * auVar23._0_4_;
            auVar80._8_4_ = auVar143._8_4_ * auVar23._8_4_;
            auVar80._12_4_ = auVar143._12_4_ * auVar23._12_4_;
            auVar80._16_4_ = auVar143._16_4_ * auVar23._16_4_;
            auVar80._20_4_ = auVar143._20_4_ * auVar23._20_4_;
            auVar80._24_4_ = auVar143._24_4_ * auVar23._24_4_;
            auVar80._28_4_ = auVar23._28_4_;
            auVar15 = vfmsub231ps_fma(auVar80,auVar132,auVar179);
            auVar81._4_4_ = auVar127._4_4_ * auVar132._4_4_;
            auVar81._0_4_ = auVar127._0_4_ * auVar132._0_4_;
            auVar81._8_4_ = auVar127._8_4_ * auVar132._8_4_;
            auVar81._12_4_ = auVar127._12_4_ * auVar132._12_4_;
            auVar81._16_4_ = auVar127._16_4_ * auVar132._16_4_;
            auVar81._20_4_ = auVar127._20_4_ * auVar132._20_4_;
            auVar81._24_4_ = auVar127._24_4_ * auVar132._24_4_;
            auVar81._28_4_ = auVar132._28_4_;
            auVar16 = vfmsub231ps_fma(auVar81,auVar143,auVar122);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
            auVar122 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
            auVar122 = vcmpps_avx(auVar122,ZEXT832(0) << 0x20,2);
            auVar13 = vpackssdw_avx(auVar122._0_16_,auVar122._16_16_);
            auVar13 = vpand_avx(auVar13,auVar11);
            auVar122 = vpmovsxwd_avx2(auVar13);
            if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar122 >> 0x7f,0) == '\0') &&
                  (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar122 >> 0xbf,0) == '\0') &&
                (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar122[0x1f]) {
LAB_018afa86:
              auVar151._8_8_ = uStack_598;
              auVar151._0_8_ = local_5a0;
              auVar151._16_8_ = uStack_590;
              auVar151._24_8_ = uStack_588;
            }
            else {
              auVar82._4_4_ = auVar24._4_4_ * auVar179._4_4_;
              auVar82._0_4_ = auVar24._0_4_ * auVar179._0_4_;
              auVar82._8_4_ = auVar24._8_4_ * auVar179._8_4_;
              auVar82._12_4_ = auVar24._12_4_ * auVar179._12_4_;
              auVar82._16_4_ = auVar24._16_4_ * auVar179._16_4_;
              auVar82._20_4_ = auVar24._20_4_ * auVar179._20_4_;
              auVar82._24_4_ = auVar24._24_4_ * auVar179._24_4_;
              auVar82._28_4_ = auVar122._28_4_;
              auVar27 = vfmsub231ps_fma(auVar82,auVar143,auVar116);
              auVar186._0_4_ = auVar116._0_4_ * auVar127._0_4_;
              auVar186._4_4_ = auVar116._4_4_ * auVar127._4_4_;
              auVar186._8_4_ = auVar116._8_4_ * auVar127._8_4_;
              auVar186._12_4_ = auVar116._12_4_ * auVar127._12_4_;
              auVar186._16_4_ = auVar116._16_4_ * auVar127._16_4_;
              auVar186._20_4_ = auVar116._20_4_ * auVar127._20_4_;
              auVar186._24_4_ = auVar116._24_4_ * auVar127._24_4_;
              auVar186._28_4_ = 0;
              auVar175 = vfmsub231ps_fma(auVar186,auVar163,auVar179);
              auVar83._4_4_ = auVar163._4_4_ * auVar143._4_4_;
              auVar83._0_4_ = auVar163._0_4_ * auVar143._0_4_;
              auVar83._8_4_ = auVar163._8_4_ * auVar143._8_4_;
              auVar83._12_4_ = auVar163._12_4_ * auVar143._12_4_;
              auVar83._16_4_ = auVar163._16_4_ * auVar143._16_4_;
              auVar83._20_4_ = auVar163._20_4_ * auVar143._20_4_;
              auVar83._24_4_ = auVar163._24_4_ * auVar143._24_4_;
              auVar83._28_4_ = auVar143._28_4_;
              auVar153 = vfmsub231ps_fma(auVar83,auVar127,auVar24);
              auVar16 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar175),ZEXT1632(auVar153));
              auVar111 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar27),ZEXT832(0) << 0x20);
              auVar122 = vrcpps_avx(ZEXT1632(auVar111));
              auVar211._8_4_ = 0x3f800000;
              auVar211._0_8_ = &DAT_3f8000003f800000;
              auVar211._12_4_ = 0x3f800000;
              auVar211._16_4_ = 0x3f800000;
              auVar211._20_4_ = 0x3f800000;
              auVar211._24_4_ = 0x3f800000;
              auVar211._28_4_ = 0x3f800000;
              auVar212 = ZEXT3264(auVar211);
              auVar16 = vfnmadd213ps_fma(auVar122,ZEXT1632(auVar111),auVar211);
              auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar122,auVar122);
              auVar149._0_4_ = auVar153._0_4_ * auVar167._0_4_;
              auVar149._4_4_ = auVar153._4_4_ * auVar167._4_4_;
              auVar149._8_4_ = auVar153._8_4_ * auVar167._8_4_;
              auVar149._12_4_ = auVar153._12_4_ * auVar167._12_4_;
              auVar149._16_4_ = auVar167._16_4_ * 0.0;
              auVar149._20_4_ = auVar167._20_4_ * 0.0;
              auVar149._24_4_ = auVar167._24_4_ * 0.0;
              auVar149._28_4_ = 0;
              auVar175 = vfmadd231ps_fma(auVar149,ZEXT1632(auVar175),auVar124);
              auVar175 = vfmadd231ps_fma(ZEXT1632(auVar175),auVar114,ZEXT1632(auVar27));
              fVar138 = auVar16._0_4_;
              fVar137 = auVar16._4_4_;
              fVar168 = auVar16._8_4_;
              fVar169 = auVar16._12_4_;
              auVar167 = ZEXT1632(CONCAT412(fVar169 * auVar175._12_4_,
                                            CONCAT48(fVar168 * auVar175._8_4_,
                                                     CONCAT44(fVar137 * auVar175._4_4_,
                                                              fVar138 * auVar175._0_4_))));
              uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar150._4_4_ = uVar109;
              auVar150._0_4_ = uVar109;
              auVar150._8_4_ = uVar109;
              auVar150._12_4_ = uVar109;
              auVar150._16_4_ = uVar109;
              auVar150._20_4_ = uVar109;
              auVar150._24_4_ = uVar109;
              auVar150._28_4_ = uVar109;
              auVar114 = vcmpps_avx(local_4a0,auVar167,2);
              auVar124 = vcmpps_avx(auVar167,auVar150,2);
              auVar114 = vandps_avx(auVar124,auVar114);
              auVar16 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
              auVar13 = vpand_avx(auVar13,auVar16);
              auVar114 = vpmovsxwd_avx2(auVar13);
              if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar114 >> 0x7f,0) == '\0') &&
                    (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar114 >> 0xbf,0) == '\0') &&
                  (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar114[0x1f]) goto LAB_018afa86;
              auVar114 = vcmpps_avx(ZEXT1632(auVar111),ZEXT832(0) << 0x20,4);
              auVar16 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
              auVar13 = vpand_avx(auVar13,auVar16);
              auVar114 = vpmovsxwd_avx2(auVar13);
              auVar151._8_8_ = uStack_598;
              auVar151._0_8_ = local_5a0;
              auVar151._16_8_ = uStack_590;
              auVar151._24_8_ = uStack_588;
              if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar114 >> 0x7f,0) != '\0') ||
                    (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar114 >> 0xbf,0) != '\0') ||
                  (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar114[0x1f] < '\0') {
                auVar122 = ZEXT1632(CONCAT412(fVar169 * auVar14._12_4_,
                                              CONCAT48(fVar168 * auVar14._8_4_,
                                                       CONCAT44(fVar137 * auVar14._4_4_,
                                                                fVar138 * auVar14._0_4_))));
                auVar84._28_4_ = SUB84(uStack_588,4);
                auVar84._0_28_ =
                     ZEXT1628(CONCAT412(fVar169 * auVar15._12_4_,
                                        CONCAT48(fVar168 * auVar15._8_4_,
                                                 CONCAT44(fVar137 * auVar15._4_4_,
                                                          fVar138 * auVar15._0_4_))));
                auVar191._8_4_ = 0x3f800000;
                auVar191._0_8_ = &DAT_3f8000003f800000;
                auVar191._12_4_ = 0x3f800000;
                auVar191._16_4_ = 0x3f800000;
                auVar191._20_4_ = 0x3f800000;
                auVar191._24_4_ = 0x3f800000;
                auVar191._28_4_ = 0x3f800000;
                auVar124 = vsubps_avx(auVar191,auVar122);
                _local_300 = vblendvps_avx(auVar124,auVar122,auVar22);
                auVar124 = vsubps_avx(auVar191,auVar84);
                local_4e0 = vblendvps_avx(auVar124,auVar84,auVar22);
                local_320 = auVar167;
                auVar151 = auVar114;
              }
            }
            auVar92._4_4_ = fStack_73c;
            auVar92._0_4_ = local_740;
            auVar92._8_4_ = fStack_738;
            auVar92._12_4_ = fStack_734;
            auVar92._16_4_ = fStack_730;
            auVar92._20_4_ = fStack_72c;
            auVar92._24_4_ = fStack_728;
            auVar92._28_4_ = fStack_724;
            if ((((((((auVar151 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar151 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar151 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar151 >> 0x7f,0) != '\0') ||
                  (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar151 >> 0xbf,0) != '\0') ||
                (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar151[0x1f] < '\0') {
              auVar114 = vsubps_avx(ZEXT1632(auVar10),auVar184);
              auVar10 = vfmadd213ps_fma(auVar114,_local_300,auVar184);
              fVar138 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar85._4_4_ = (auVar10._4_4_ + auVar10._4_4_) * fVar138;
              auVar85._0_4_ = (auVar10._0_4_ + auVar10._0_4_) * fVar138;
              auVar85._8_4_ = (auVar10._8_4_ + auVar10._8_4_) * fVar138;
              auVar85._12_4_ = (auVar10._12_4_ + auVar10._12_4_) * fVar138;
              auVar85._16_4_ = fVar138 * 0.0;
              auVar85._20_4_ = fVar138 * 0.0;
              auVar85._24_4_ = fVar138 * 0.0;
              auVar85._28_4_ = fVar138;
              auVar114 = vcmpps_avx(local_320,auVar85,6);
              auVar124 = auVar151 & auVar114;
              if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar124 >> 0x7f,0) != '\0') ||
                    (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar124 >> 0xbf,0) != '\0') ||
                  (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar124[0x1f] < '\0') {
                local_3a0 = vandps_avx(auVar114,auVar151);
                auVar134._8_4_ = 0xbf800000;
                auVar134._0_8_ = 0xbf800000bf800000;
                auVar134._12_4_ = 0xbf800000;
                auVar134._16_4_ = 0xbf800000;
                auVar134._20_4_ = 0xbf800000;
                auVar134._24_4_ = 0xbf800000;
                auVar134._28_4_ = 0xbf800000;
                auVar147._8_4_ = 0x40000000;
                auVar147._0_8_ = 0x4000000040000000;
                auVar147._12_4_ = 0x40000000;
                auVar147._16_4_ = 0x40000000;
                auVar147._20_4_ = 0x40000000;
                auVar147._24_4_ = 0x40000000;
                auVar147._28_4_ = 0x40000000;
                auVar10 = vfmadd213ps_fma(local_4e0,auVar147,auVar134);
                local_460 = _local_300;
                local_440 = ZEXT1632(auVar10);
                local_420 = local_320;
                local_3e0 = local_690;
                uStack_3d8 = uStack_688;
                local_3d0 = local_6a0;
                uStack_3c8 = uStack_698;
                local_3c0 = local_6b0;
                uStack_3b8 = uStack_6a8;
                pGVar18 = (context->scene->geometries).items[uVar99].ptr;
                auVar196 = ZEXT3264(auVar92);
                local_4e0 = local_440;
                if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  bVar108 = false;
                  auVar135 = ZEXT3264(CONCAT428(fVar223,CONCAT424(fVar219,CONCAT420(fVar223,
                                                  CONCAT416(fVar219,CONCAT412(fVar223,CONCAT48(
                                                  fVar219,uVar110)))))));
                }
                else {
                  auVar135 = ZEXT3264(CONCAT428(fVar223,CONCAT424(fVar219,CONCAT420(fVar223,
                                                  CONCAT416(fVar219,CONCAT412(fVar223,CONCAT48(
                                                  fVar219,uVar110)))))));
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar108 = true, pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar138 = (float)local_400;
                    local_380[0] = (fVar138 + (float)local_300._0_4_ + 0.0) * local_160;
                    local_380[1] = (fVar138 + (float)local_300._4_4_ + 1.0) * fStack_15c;
                    local_380[2] = (fVar138 + fStack_2f8 + 2.0) * fStack_158;
                    local_380[3] = (fVar138 + fStack_2f4 + 3.0) * fStack_154;
                    fStack_370 = (fVar138 + fStack_2f0 + 4.0) * fStack_150;
                    fStack_36c = (fVar138 + fStack_2ec + 5.0) * fStack_14c;
                    fStack_368 = (fVar138 + fStack_2e8 + 6.0) * fStack_148;
                    fStack_364 = fVar138 + fStack_2e4 + 7.0;
                    local_4e0._0_8_ = auVar10._0_8_;
                    local_4e0._8_8_ = auVar10._8_8_;
                    local_360 = local_4e0._0_8_;
                    uStack_358 = local_4e0._8_8_;
                    uStack_350 = 0;
                    uStack_348 = 0;
                    local_340 = local_320._0_8_;
                    uStack_338 = local_320._8_8_;
                    uStack_330 = local_320._16_8_;
                    uStack_328 = local_320._24_8_;
                    uVar101 = vmovmskps_avx(local_3a0);
                    bVar108 = uVar101 != 0;
                    if (bVar108) {
                      uVar102 = (ulong)(uVar101 & 0xff);
                      local_920 = ZEXT1632(CONCAT88(auVar11._8_8_,uVar102));
                      lVar26 = 0;
                      for (; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x8000000000000000) {
                        lVar26 = lVar26 + 1;
                      }
                      local_940 = ZEXT1632(CONCAT88(auVar20._8_8_,lVar26));
                      local_640._0_16_ = CONCAT88(uStack_688,local_690);
                      local_640 = ZEXT1632(local_640._0_16_);
                      local_6e0._0_16_ = CONCAT88(uStack_698,local_6a0);
                      local_6e0 = ZEXT1632(local_6e0._0_16_);
                      _local_700 = CONCAT88(uStack_6a8,local_6b0);
                      _local_700 = ZEXT1632(_local_700);
                      local_3fc = iVar100;
                      local_3f0 = uVar174;
                      uStack_3e8 = uVar91;
                      do {
                        uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
                        fVar138 = local_380[local_940._0_8_];
                        auVar113._4_4_ = fVar138;
                        auVar113._0_4_ = fVar138;
                        auVar113._8_4_ = fVar138;
                        auVar113._12_4_ = fVar138;
                        local_220._16_4_ = fVar138;
                        local_220._0_16_ = auVar113;
                        local_220._20_4_ = fVar138;
                        local_220._24_4_ = fVar138;
                        local_220._28_4_ = fVar138;
                        local_200._4_4_ = *(undefined4 *)((long)&local_360 + local_940._0_8_ * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)((long)&local_340 + local_940._0_8_ * 4);
                        fVar137 = 1.0 - fVar138;
                        auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar113,
                                                  ZEXT416(0xc0a00000));
                        auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar138 * fVar138 * 3.0)),
                                                  ZEXT416((uint)(fVar138 + fVar138)),auVar20);
                        auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar113,
                                                  ZEXT416(0x40000000));
                        auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar137 * fVar137 * -3.0)),
                                                  ZEXT416((uint)(fVar137 + fVar137)),auVar20);
                        auVar13 = vfnmadd231ss_fma(ZEXT416((uint)(fVar138 * (fVar137 + fVar137))),
                                                   ZEXT416((uint)fVar137),ZEXT416((uint)fVar137));
                        auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar138 * fVar138)),auVar113,
                                                  ZEXT416((uint)(fVar137 * -2.0)));
                        fVar138 = auVar20._0_4_ * 0.5;
                        fVar137 = auVar11._0_4_ * 0.5;
                        auVar156._0_4_ = fVar137 * (float)local_700._0_4_;
                        auVar156._4_4_ = fVar137 * (float)local_700._4_4_;
                        auVar156._8_4_ = fVar137 * (float)uStack_6f8;
                        auVar156._12_4_ = fVar137 * uStack_6f8._4_4_;
                        auVar141._4_4_ = fVar138;
                        auVar141._0_4_ = fVar138;
                        auVar141._8_4_ = fVar138;
                        auVar141._12_4_ = fVar138;
                        auVar20 = vfmadd132ps_fma(auVar141,auVar156,local_6e0._0_16_);
                        fVar138 = auVar10._0_4_ * 0.5;
                        auVar157._4_4_ = fVar138;
                        auVar157._0_4_ = fVar138;
                        auVar157._8_4_ = fVar138;
                        auVar157._12_4_ = fVar138;
                        auVar20 = vfmadd132ps_fma(auVar157,auVar20,local_640._0_16_);
                        local_770.context = context->user;
                        fVar138 = auVar13._0_4_ * 0.5;
                        auVar142._4_4_ = fVar138;
                        auVar142._0_4_ = fVar138;
                        auVar142._8_4_ = fVar138;
                        auVar142._12_4_ = fVar138;
                        auVar10 = vfmadd132ps_fma(auVar142,auVar20,auVar21);
                        local_280 = auVar10._0_4_;
                        uStack_27c = local_280;
                        uStack_278 = local_280;
                        uStack_274 = local_280;
                        uStack_270 = local_280;
                        uStack_26c = local_280;
                        uStack_268 = local_280;
                        uStack_264 = local_280;
                        auVar20 = vmovshdup_avx(auVar10);
                        local_260 = auVar20._0_8_;
                        uStack_258 = local_260;
                        uStack_250 = local_260;
                        uStack_248 = local_260;
                        auVar20 = vshufps_avx(auVar10,auVar10,0xaa);
                        local_240 = auVar20._0_8_;
                        uStack_238 = local_240;
                        uStack_230 = local_240;
                        uStack_228 = local_240;
                        local_200._0_4_ = local_200._4_4_;
                        local_200._8_4_ = local_200._4_4_;
                        local_200._12_4_ = local_200._4_4_;
                        local_200._16_4_ = local_200._4_4_;
                        local_200._20_4_ = local_200._4_4_;
                        local_200._24_4_ = local_200._4_4_;
                        local_200._28_4_ = local_200._4_4_;
                        local_1e0 = local_540;
                        uStack_1d8 = CONCAT44(uStack_534,uStack_538);
                        uStack_1d0 = CONCAT44(uStack_52c,uStack_530);
                        uStack_1c8 = CONCAT44(uStack_524,uStack_528);
                        local_1c0._4_4_ = uStack_13c;
                        local_1c0._0_4_ = local_140;
                        local_1c0._8_4_ = uStack_138;
                        local_1c0._12_4_ = uStack_134;
                        local_1c0._16_4_ = uStack_130;
                        local_1c0._20_4_ = uStack_12c;
                        local_1c0._24_4_ = uStack_128;
                        local_1c0._28_4_ = uStack_124;
                        vpcmpeqd_avx2(local_1c0,local_1c0);
                        local_1a0 = (local_770.context)->instID[0];
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = (local_770.context)->instPrimID[0];
                        uStack_17c = local_180;
                        uStack_178 = local_180;
                        uStack_174 = local_180;
                        uStack_170 = local_180;
                        uStack_16c = local_180;
                        uStack_168 = local_180;
                        uStack_164 = local_180;
                        local_5e0 = local_2e0._0_8_;
                        uStack_5d8 = local_2e0._8_8_;
                        uStack_5d0 = local_2e0._16_8_;
                        uStack_5c8 = local_2e0._24_8_;
                        local_770.valid = (int *)&local_5e0;
                        local_770.geometryUserPtr = pGVar18->userPtr;
                        local_770.hit = (RTCHitN *)&local_280;
                        local_770.N = 8;
                        local_770.ray = (RTCRayN *)ray;
                        if (pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar212 = ZEXT1664(auVar212._0_16_);
                          (*pGVar18->occlusionFilterN)(&local_770);
                        }
                        auVar95._8_8_ = uStack_5d8;
                        auVar95._0_8_ = local_5e0;
                        auVar95._16_8_ = uStack_5d0;
                        auVar95._24_8_ = uStack_5c8;
                        auVar124 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar95)
                        ;
                        auVar114 = _DAT_0205a980 & ~auVar124;
                        if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar114 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar114 >> 0x7f,0) == '\0')
                              && (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar114 >> 0xbf,0) == '\0') &&
                            (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar114[0x1f]) {
                          auVar124 = auVar124 ^ _DAT_0205a980;
                        }
                        else {
                          p_Var19 = context->args->filter;
                          if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar212 = ZEXT1664(auVar212._0_16_);
                            (*p_Var19)(&local_770);
                          }
                          auVar96._8_8_ = uStack_5d8;
                          auVar96._0_8_ = local_5e0;
                          auVar96._16_8_ = uStack_5d0;
                          auVar96._24_8_ = uStack_5c8;
                          auVar114 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                   auVar96);
                          auVar124 = auVar114 ^ _DAT_0205a980;
                          auVar148._8_4_ = 0xff800000;
                          auVar148._0_8_ = 0xff800000ff800000;
                          auVar148._12_4_ = 0xff800000;
                          auVar148._16_4_ = 0xff800000;
                          auVar148._20_4_ = 0xff800000;
                          auVar148._24_4_ = 0xff800000;
                          auVar148._28_4_ = 0xff800000;
                          auVar114 = vblendvps_avx(auVar148,*(undefined1 (*) [32])
                                                             (local_770.ray + 0x100),auVar114);
                          *(undefined1 (*) [32])(local_770.ray + 0x100) = auVar114;
                        }
                        if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar124 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar124 >> 0x7f,0) != '\0')
                              || (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar124 >> 0xbf,0) != '\0') ||
                            (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar124[0x1f] < '\0') break;
                        *(undefined4 *)(ray + k * 4 + 0x100) = uVar109;
                        uVar104 = local_920._0_8_ ^ 1L << (local_940._0_8_ & 0x3f);
                        local_920._0_8_ = uVar104;
                        lVar26 = 0;
                        for (uVar102 = uVar104; (uVar102 & 1) == 0;
                            uVar102 = uVar102 >> 1 | 0x8000000000000000) {
                          lVar26 = lVar26 + 1;
                        }
                        bVar108 = uVar104 != 0;
                        local_940._0_8_ = lVar26;
                      } while (bVar108);
                    }
                    auVar196 = ZEXT3264(CONCAT428(fStack_724,
                                                  CONCAT424(fStack_728,
                                                            CONCAT420(fStack_72c,
                                                                      CONCAT416(fStack_730,
                                                                                CONCAT412(fStack_734
                                                                                          ,CONCAT48(
                                                  fStack_738,CONCAT44(fStack_73c,local_740))))))));
                    auVar135 = ZEXT3264(CONCAT428(fVar223,CONCAT424(fVar219,CONCAT420(fVar223,
                                                  CONCAT416(fVar219,CONCAT412(fVar223,CONCAT48(
                                                  fVar219,uVar110)))))));
                  }
                }
                bVar107 = (bool)(bVar107 | bVar108);
                auVar152 = ZEXT3264(local_600);
                goto LAB_018af528;
              }
            }
            auVar152 = ZEXT3264(local_600);
            auVar135 = ZEXT3264(CONCAT428(fVar223,CONCAT424(fVar219,CONCAT420(fVar223,CONCAT416(
                                                  fVar219,CONCAT412(fVar223,CONCAT48(fVar219,uVar110
                                                                                    )))))));
            auVar196 = ZEXT3264(auVar92);
          }
LAB_018af528:
          lVar105 = lVar105 + 8;
        } while ((int)lVar105 < iVar100);
      }
      if (bVar107) {
        return local_94d;
      }
      uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar123._4_4_ = uVar109;
      auVar123._0_4_ = uVar109;
      auVar123._8_4_ = uVar109;
      auVar123._12_4_ = uVar109;
      auVar123._16_4_ = uVar109;
      auVar123._20_4_ = uVar109;
      auVar123._24_4_ = uVar109;
      auVar123._28_4_ = uVar109;
      auVar114 = vcmpps_avx(local_80,auVar123,2);
      uVar99 = vmovmskps_avx(auVar114);
      uVar99 = (uint)uVar106 & uVar99;
      local_94d = uVar99 != 0;
    } while (local_94d);
  }
  return local_94d;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }